

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRD2File.cpp
# Opt level: O1

void __thiscall BRD2File::BRD2File(BRD2File *this,vector<char,_std::allocator<char>_> *buf)

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  vector<BRDPart,_std::allocator<BRDPart>_> *this_00;
  pointer *ppBVar3;
  string *psVar4;
  byte bVar5;
  pointer __src;
  iterator __position;
  __node_base_ptr p_Var6;
  iterator __position_00;
  iterator __position_01;
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  pointer pBVar10;
  pointer pBVar11;
  size_t __size;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  char *pcVar15;
  int extraout_var;
  BRDPoint BVar16;
  BRDPoint extraout_RAX;
  __node_base_ptr p_Var17;
  _Hash_node_base *p_Var18;
  BRDPoint extraout_RAX_00;
  BRDPoint extraout_RAX_01;
  BRDPoint extraout_RAX_02;
  long *plVar19;
  undefined8 *puVar20;
  BRDPoint *pBVar21;
  long *plVar22;
  long lVar23;
  size_t __n;
  ulong uVar24;
  bool bVar25;
  uint uVar26;
  byte *pbVar27;
  byte *pbVar28;
  BRDPoint BVar29;
  BRDPoint BVar30;
  BRDPoint BVar31;
  BRDPoint BVar32;
  BRDPoint BVar33;
  BRDPoint BVar34;
  BRDPoint BVar35;
  BRDPoint BVar36;
  BRDPoint BVar37;
  BRDPoint BVar38;
  BRDPoint BVar39;
  BRDPoint BVar40;
  BRDPoint BVar41;
  BRDPoint BVar42;
  BRDPoint BVar43;
  BRDPoint BVar44;
  BRDPoint BVar45;
  BRDPoint BVar46;
  BRDPoint BVar47;
  BRDPoint BVar48;
  BRDPoint BVar49;
  BRDPoint BVar50;
  BRDPoint BVar51;
  BRDPoint BVar52;
  BRDPoint BVar53;
  BRDPoint BVar54;
  BRDPoint BVar55;
  BRDPoint BVar56;
  BRDPoint BVar57;
  BRDPoint BVar58;
  BRDPoint BVar59;
  BRDPoint BVar60;
  BRDPoint BVar61;
  BRDPoint BVar62;
  BRDPoint BVar63;
  BRDPoint BVar64;
  BRDPoint BVar65;
  BRDPoint BVar66;
  BRDPoint BVar67;
  BRDPoint BVar68;
  BRDPoint BVar69;
  BRDPoint BVar70;
  BRDPoint BVar71;
  BRDPoint BVar72;
  BRDPoint BVar73;
  BRDPoint BVar74;
  BRDPoint BVar75;
  BRDPoint BVar76;
  BRDPoint BVar77;
  BRDPoint BVar78;
  BRDPoint BVar79;
  BRDPoint BVar80;
  BRDPoint BVar81;
  BRDPoint BVar82;
  long lVar83;
  __node_base_ptr p_Var84;
  BRDPinSide *pBVar85;
  long lVar86;
  int iVar87;
  pointer ppcVar88;
  BRDPartMountingSide *pBVar89;
  BRDFileBase *pBVar90;
  string __str;
  char *p;
  BRDPoint point;
  BRDPart part;
  int netid;
  char *arena;
  vector<char_*,_std::allocator<char_*>_> lines;
  unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
  nets;
  BRDPoint local_260;
  BRDPoint local_258;
  BRDPoint local_250;
  BRDPoint *local_240;
  long local_238;
  BRDPoint local_230;
  long lStack_228;
  long *local_220;
  undefined8 local_218;
  long local_210;
  undefined8 uStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  BRDPoint *local_180;
  BRDPoint local_178;
  BRDPoint local_170;
  long lStack_168;
  byte *local_160;
  pointer local_158;
  BRDFileBase *local_150;
  BRDNail local_148;
  undefined1 local_128 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  char *pcStack_100;
  uint uStack_f8;
  int iStack_f4;
  int iStack_f0;
  BRDPoint BStack_ec;
  BRDPoint local_e0;
  BRDPoint local_d8;
  BRDPinSide *local_d0;
  uint *local_c8;
  int local_bc;
  char *local_b8;
  char *local_b0;
  vector<char_*,_std::allocator<char_*>_> local_a8;
  vector<BRDNail,std::allocator<BRDNail>> *local_90;
  vector<BRDPoint,std::allocator<BRDPoint>> *local_88;
  vector<BRDPin,std::allocator<BRDPin>> *local_80;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_78;
  pointer local_70;
  _Hashtable<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022e2f8;
  uVar24 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_150 = &this->super_BRDFileBase;
  if (4 < uVar24) {
    __size = (uVar24 + 1) * 3;
    pcVar15 = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = pcVar15;
    if (pcVar15 != (char *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar15,__src,__n);
      }
      pcVar15[uVar24] = '\0';
      local_b0 = pcVar15 + uVar24 + 1;
      local_d8.x = 0;
      local_d8.y = 0;
      pcVar15[__size - 1] = '\0';
      local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile(pcVar15,&local_a8);
      local_d0 = (BRDPinSide *)
                 local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      pBVar90 = local_150;
      if (local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_e0.x = 0;
        local_e0.y = 0;
        pBVar85 = (BRDPinSide *)0x0;
      }
      else {
        local_b8 = pcVar15 + (__size - 1);
        local_90 = (vector<BRDNail,std::allocator<BRDNail>> *)&local_150->nails;
        local_158 = (pointer)&local_150->error_msg;
        local_80 = (vector<BRDPin,std::allocator<BRDPin>> *)&local_150->pins;
        local_78 = &local_150->parts;
        local_88 = (vector<BRDPoint,std::allocator<BRDPoint>> *)&local_150->format;
        local_e0.x = 0;
        local_e0.y = 0;
        iVar87 = 0;
        local_d8.x = 0;
        local_d8.y = 0;
        local_c8 = (uint *)0x0;
        ppcVar88 = local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          pbVar28 = (byte *)(*ppcVar88 + -1);
          do {
            pbVar27 = pbVar28;
            bVar5 = pbVar27[1];
            pbVar28 = pbVar27 + 1;
            BVar16.x = isspace((uint)bVar5);
            BVar16.y = extraout_var;
          } while (BVar16.x != 0);
          if (bVar5 != 0) {
            local_160 = pbVar28;
            iVar14 = strncmp((char *)pbVar28,"BRDOUT:",7);
            if (iVar14 == 0) {
              local_160 = pbVar27 + 8;
              lVar23 = strtol((char *)local_160,(char **)&local_160,10);
              if ((int)(uint)lVar23 < 0) {
                local_180 = &local_170;
                local_260.x = 0x7a;
                local_260.y = 0;
                pBVar21 = (BRDPoint *)
                          std::__cxx11::string::_M_create((ulong *)&local_180,(ulong)&local_260);
                BVar16 = local_260;
                local_170 = local_260;
                local_180 = pBVar21;
                memcpy(pBVar21,
                       "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                       ,0x7a);
                local_178 = BVar16;
                *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                pBVar21 = (BRDPoint *)(plVar19 + 2);
                if ((BRDPoint *)*plVar19 == pBVar21) {
                  local_230 = *pBVar21;
                  lStack_228 = plVar19[3];
                  local_240 = &local_230;
                }
                else {
                  local_230 = *pBVar21;
                  local_240 = (BRDPoint *)*plVar19;
                }
                local_238 = plVar19[1];
                *plVar19 = (long)pBVar21;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                local_260 = (BRDPoint)&local_250;
                std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                *(undefined2 *)local_260 = 0x3734;
                BVar29.x = 0xf;
                BVar29.y = 0;
                if (local_240 != &local_230) {
                  BVar29 = local_230;
                }
                if ((ulong)BVar29 < (ulong)((long)local_258 + local_238)) {
                  BVar30.x = 0xf;
                  BVar30.y = 0;
                  if (local_260 != (BRDPoint)&local_250) {
                    BVar30 = local_250;
                  }
                  if ((ulong)BVar30 < (ulong)((long)local_258 + local_238)) goto LAB_0012ea64;
                  puVar20 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                }
                else {
LAB_0012ea64:
                  puVar20 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                }
                plVar19 = puVar20 + 2;
                if ((long *)*puVar20 == plVar19) {
                  local_210 = *plVar19;
                  uStack_208 = puVar20[3];
                  local_220 = &local_210;
                }
                else {
                  local_210 = *plVar19;
                  local_220 = (long *)*puVar20;
                }
                local_218 = puVar20[1];
                *puVar20 = plVar19;
                puVar20[1] = 0;
                *(undefined1 *)plVar19 = 0;
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                plVar22 = plVar19 + 2;
                if ((long *)*plVar19 == plVar22) {
                  local_1b0 = *plVar22;
                  lStack_1a8 = plVar19[3];
                  local_1c0 = &local_1b0;
                }
                else {
                  local_1b0 = *plVar22;
                  local_1c0 = (long *)*plVar19;
                }
                local_1b8 = plVar19[1];
                *plVar19 = (long)plVar22;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                local_200 = &local_1f0;
                plVar22 = plVar19 + 2;
                if ((long *)*plVar19 == plVar22) {
                  local_1f0 = *plVar22;
                  lStack_1e8 = plVar19[3];
                }
                else {
                  local_1f0 = *plVar22;
                  local_200 = (long *)*plVar19;
                }
                local_1f8 = plVar19[1];
                *plVar19 = (long)plVar22;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                local_1e0 = &local_1d0;
                plVar22 = plVar19 + 2;
                if ((long *)*plVar19 == plVar22) {
                  local_1d0 = *plVar22;
                  lStack_1c8 = plVar19[3];
                }
                else {
                  local_1d0 = *plVar22;
                  local_1e0 = (long *)*plVar19;
                }
                local_1d8 = plVar19[1];
                *plVar19 = (long)plVar22;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                local_70 = ppcVar88;
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                local_1a0 = &local_190;
                plVar22 = plVar19 + 2;
                if ((long *)*plVar19 == plVar22) {
                  local_190 = *plVar22;
                  lStack_188 = plVar19[3];
                }
                else {
                  local_190 = *plVar22;
                  local_1a0 = (long *)*plVar19;
                }
                local_198 = plVar19[1];
                *plVar19 = (long)plVar22;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                BVar16 = (BRDPoint)(pBVar21 + 2);
                if (*pBVar21 == BVar16) {
                  local_128._16_8_ = *(undefined8 *)BVar16;
                  aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                  local_128._0_8_ = (long)local_128 + 0x10;
                }
                else {
                  local_128._16_8_ = *(undefined8 *)BVar16;
                  local_128._0_8_ = *pBVar21;
                }
                local_128._8_8_ = pBVar21[1];
                *pBVar21 = BVar16;
                pBVar21[1].x = 0;
                pBVar21[1].y = 0;
                *(undefined1 *)&pBVar21[2].x = 0;
                std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                if (local_128._0_8_ != (long)local_128 + 0x10) {
                  operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                }
                if (local_1a0 != &local_190) {
                  operator_delete(local_1a0,local_190 + 1);
                }
                if (local_1e0 != &local_1d0) {
                  operator_delete(local_1e0,local_1d0 + 1);
                }
                if (local_200 != &local_1f0) {
                  operator_delete(local_200,local_1f0 + 1);
                }
                if (local_1c0 != &local_1b0) {
                  operator_delete(local_1c0,local_1b0 + 1);
                }
                if (local_220 != &local_210) {
                  operator_delete(local_220,local_210 + 1);
                }
                if (local_260 != (BRDPoint)&local_250) {
                  operator_delete((void *)local_260,(long)local_250 + 1);
                }
                if (local_240 != &local_230) {
                  operator_delete(local_240,(long)local_230 + 1);
                }
                ppcVar88 = local_70;
                if (local_180 != &local_170) {
                  operator_delete(local_180,(long)local_170 + 1);
                }
                SDL_LogError(1,"%s",local_158->name);
              }
              pBVar90->num_format = (uint)lVar23;
              local_c8 = (uint *)strtol((char *)local_160,(char **)&local_160,10);
              BVar16 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
              iVar87 = 1;
              local_d8 = BVar16;
            }
            else {
              iVar14 = strncmp((char *)pbVar28,"NETS:",5);
              if (iVar14 != 0) {
                iVar14 = strncmp((char *)pbVar28,"PARTS:",6);
                if (iVar14 != 0) {
                  iVar14 = strncmp((char *)pbVar28,"PINS:",5);
                  if (iVar14 != 0) {
                    iVar14 = strncmp((char *)pbVar28,"NAILS:",6);
                    pBVar90 = local_150;
                    if (iVar14 != 0) {
                      BVar16.x = iVar87 - 1;
                      BVar16.y = 0;
                      switch(BVar16) {
                      case (BRDPoint)0x0:
                        goto switchD_0012e528_caseD_0;
                      case (BRDPoint)0x1:
                        if ((long *)((ulong)local_e0 & 0xffffffff) <= local_68._M_element_count) {
                          local_180 = &local_170;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_180,
                                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                     ,"");
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                            local_240 = &local_230;
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          local_260 = (BRDPoint)&local_250;
                          std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                          *(undefined2 *)local_260 = 0x3938;
                          BVar47.x = 0xf;
                          BVar47.y = 0;
                          if (local_240 != &local_230) {
                            BVar47 = local_230;
                          }
                          if ((ulong)BVar47 < (ulong)((long)local_258 + local_238)) {
                            BVar48.x = 0xf;
                            BVar48.y = 0;
                            if (local_260 != (BRDPoint)&local_250) {
                              BVar48 = local_250;
                            }
                            if ((ulong)BVar48 < (ulong)((long)local_258 + local_238))
                            goto LAB_0013055c;
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::replace
                                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                          }
                          else {
LAB_0013055c:
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::_M_append
                                                ((char *)&local_240,(ulong)local_260);
                          }
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                            local_220 = &local_210;
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)plVar19 = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                            local_1c0 = &local_1b0;
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          local_200 = &local_1f0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          local_1e0 = &local_1d0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          local_1a0 = &local_190;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                          BVar16 = (BRDPoint)(pBVar21 + 2);
                          if (*pBVar21 == BVar16) {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                            local_128._0_8_ = (long)local_128 + 0x10;
                          }
                          else {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            local_128._0_8_ = *pBVar21;
                          }
                          local_128._8_8_ = pBVar21[1];
                          *pBVar21 = BVar16;
                          pBVar21[1].x = 0;
                          pBVar21[1].y = 0;
                          *(undefined1 *)&pBVar21[2].x = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                          if (local_128._0_8_ != (long)local_128 + 0x10) {
                            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                          }
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        if ((int)lVar23 < 0) {
                          local_260.x = 0x7a;
                          local_260.y = 0;
                          local_180 = &local_170;
                          pBVar21 = (BRDPoint *)
                                    std::__cxx11::string::_M_create
                                              ((ulong *)&local_180,(ulong)&local_260);
                          BVar16 = local_260;
                          local_170 = local_260;
                          local_180 = pBVar21;
                          memcpy(pBVar21,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,0x7a);
                          local_178 = BVar16;
                          *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                          local_240 = &local_230;
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          local_260 = (BRDPoint)&local_250;
                          std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                          *(undefined2 *)local_260 = 0x3039;
                          BVar55.x = 0xf;
                          BVar55.y = 0;
                          if (local_240 != &local_230) {
                            BVar55 = local_230;
                          }
                          if ((ulong)BVar55 < (ulong)((long)local_258 + local_238)) {
                            BVar56.x = 0xf;
                            BVar56.y = 0;
                            if (local_260 != (BRDPoint)&local_250) {
                              BVar56 = local_250;
                            }
                            if ((ulong)BVar56 < (ulong)((long)local_258 + local_238))
                            goto LAB_00131e7b;
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::replace
                                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                          }
                          else {
LAB_00131e7b:
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::_M_append
                                                ((char *)&local_240,(ulong)local_260);
                          }
                          local_220 = &local_210;
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)plVar19 = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          local_1c0 = &local_1b0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                            local_200 = &local_1f0;
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                            local_1e0 = &local_1d0;
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          local_1a0 = &local_190;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                          BVar16 = (BRDPoint)(pBVar21 + 2);
                          if (*pBVar21 == BVar16) {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                            local_128._0_8_ = (long)local_128 + 0x10;
                          }
                          else {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            local_128._0_8_ = *pBVar21;
                          }
                          local_128._8_8_ = pBVar21[1];
                          *pBVar21 = BVar16;
                          pBVar21[1].x = 0;
                          pBVar21[1].y = 0;
                          *(undefined1 *)&pBVar21[2].x = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                          if (local_128._0_8_ != (long)local_128 + 0x10) {
                            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                          }
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        pbVar28 = local_160;
                        local_148.probe = (int)lVar23;
                        if (*local_160 != 0) {
                          iVar14 = isspace((uint)*local_160);
                          while (iVar14 != 0) {
                            pbVar28 = pbVar28 + 1;
                            if (*pbVar28 == 0) break;
                            iVar14 = isspace((uint)*pbVar28);
                          }
                        }
                        local_160 = pbVar28;
                        pbVar27 = local_160;
                        pbVar28 = local_160;
                        if (*local_160 != 0) {
                          iVar14 = isspace((uint)*local_160);
                          pbVar28 = pbVar27;
                          while (iVar14 == 0) {
                            pbVar28 = pbVar28 + 1;
                            if (*pbVar28 == 0) break;
                            iVar14 = isspace((uint)*pbVar28);
                          }
                        }
                        local_160 = pbVar28;
                        *local_160 = 0;
                        local_160 = local_160 + 1;
                        pcVar15 = fix_to_utf8((char *)pbVar27,&local_b0,local_b8);
                        BVar16 = (BRDPoint)
                                 std::__detail::
                                 _Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)&local_68,(key_type *)&local_148);
                        *(char **)BVar16 = pcVar15;
                        pBVar90 = local_150;
                        goto switchD_0012e528_default;
                      case (BRDPoint)0x2:
                        if ((ulong)local_150->num_parts <=
                            (ulong)(((long)(local_150->parts).
                                           super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(local_150->parts).
                                           super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x71c71c71c71c71c7)) {
                          local_180 = &local_170;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_180,
                                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                     ,"");
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                            local_240 = &local_230;
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          local_260 = (BRDPoint)&local_250;
                          std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                          *(undefined2 *)local_260 = 0x3539;
                          BVar41.x = 0xf;
                          BVar41.y = 0;
                          if (local_240 != &local_230) {
                            BVar41 = local_230;
                          }
                          if ((ulong)BVar41 < (ulong)((long)local_258 + local_238)) {
                            BVar42.x = 0xf;
                            BVar42.y = 0;
                            if (local_260 != (BRDPoint)&local_250) {
                              BVar42 = local_250;
                            }
                            if ((ulong)BVar42 < (ulong)((long)local_258 + local_238))
                            goto LAB_00130363;
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::replace
                                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                          }
                          else {
LAB_00130363:
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::_M_append
                                                ((char *)&local_240,(ulong)local_260);
                          }
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                            local_220 = &local_210;
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)plVar19 = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                            local_1c0 = &local_1b0;
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          local_200 = &local_1f0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          local_1e0 = &local_1d0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          local_1a0 = &local_190;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                          BVar16 = (BRDPoint)(pBVar21 + 2);
                          if (*pBVar21 == BVar16) {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                            local_128._0_8_ = (long)local_128 + 0x10;
                          }
                          else {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            local_128._0_8_ = *pBVar21;
                          }
                          local_128._8_8_ = pBVar21[1];
                          *pBVar21 = BVar16;
                          pBVar21[1].x = 0;
                          pBVar21[1].y = 0;
                          *(undefined1 *)&pBVar21[2].x = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                          if (local_128._0_8_ != (long)local_128 + 0x10) {
                            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                          }
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        pbVar28 = local_160;
                        local_128._0_4_ = 0;
                        local_128._4_4_ = 0;
                        local_128._8_8_ = &aStack_110;
                        local_128._16_8_ = 0;
                        aStack_110._M_allocated_capacity =
                             aStack_110._M_allocated_capacity & 0xffffffffffffff00;
                        iStack_f0 = 0;
                        BStack_ec.x = 0;
                        BStack_ec.y = 0;
                        pcStack_100 = (char *)0x0;
                        uStack_f8 = 0;
                        iStack_f4 = 0;
                        if (*local_160 != 0) {
                          iVar14 = isspace((uint)*local_160);
                          while (iVar14 != 0) {
                            pbVar28 = pbVar28 + 1;
                            if (*pbVar28 == 0) break;
                            iVar14 = isspace((uint)*pbVar28);
                          }
                        }
                        local_160 = pbVar28;
                        pbVar27 = local_160;
                        pbVar28 = local_160;
                        if (*local_160 != 0) {
                          iVar14 = isspace((uint)*local_160);
                          pbVar28 = pbVar27;
                          while (iVar14 == 0) {
                            pbVar28 = pbVar28 + 1;
                            if (*pbVar28 == 0) break;
                            iVar14 = isspace((uint)*pbVar28);
                          }
                        }
                        local_160 = pbVar28;
                        *local_160 = 0;
                        local_160 = local_160 + 1;
                        local_128._0_8_ = fix_to_utf8((char *)pbVar27,&local_b0,local_b8);
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        iStack_f4 = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        iStack_f0 = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        BStack_ec.x = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        BStack_ec.y = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        if ((int)(uint)lVar23 < 0) {
                          local_260 = (BRDPoint)&local_250;
                          local_148.probe = 0x7a;
                          local_148.pos.x = 0;
                          BVar16 = (BRDPoint)
                                   std::__cxx11::string::_M_create
                                             ((ulong *)&local_260,(ulong)&local_148);
                          uVar12 = local_148._0_8_;
                          local_250.x = local_148.probe;
                          local_250.y = local_148.pos.x;
                          local_260 = BVar16;
                          memcpy((void *)BVar16,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,0x7a);
                          uVar13 = local_148._0_8_;
                          local_148.probe = (uint)uVar12;
                          local_148.pos.x = SUB84(uVar12,4);
                          local_258.x = local_148.probe;
                          local_258.y = local_148.pos.x;
                          *(undefined1 *)((long)BVar16 + uVar12) = 0;
                          local_148._0_8_ = uVar13;
                          puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                          pBVar21 = (BRDPoint *)(puVar20 + 2);
                          local_148._0_8_ = &local_148.net;
                          if ((BRDPoint *)*puVar20 == pBVar21) {
                            local_170 = *pBVar21;
                            lStack_168 = puVar20[3];
                            local_180 = &local_170;
                          }
                          else {
                            local_170 = *pBVar21;
                            local_180 = (BRDPoint *)*puVar20;
                          }
                          local_178 = *(BRDPoint *)(puVar20 + 1);
                          *puVar20 = pBVar21;
                          puVar20[1] = 0;
                          *(undefined1 *)(puVar20 + 2) = 0;
                          std::__cxx11::string::_M_construct((ulong)&local_148,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>
                                    ((char *)local_148._0_8_,3,0x67);
                          BVar59.x = 0xf;
                          BVar59.y = 0;
                          if (local_180 != &local_170) {
                            BVar59 = local_170;
                          }
                          if ((ulong)BVar59 < (ulong)(local_148._8_8_ + (long)local_178)) {
                            BVar60.x = 0xf;
                            BVar60.y = 0;
                            if ((BRDPoint *)local_148._0_8_ != (BRDPoint *)&local_148.net) {
                              BVar60 = (BRDPoint)local_148.net;
                            }
                            if ((ulong)BVar60 < (ulong)(local_148._8_8_ + (long)local_178))
                            goto LAB_00132944;
                            plVar19 = (long *)std::__cxx11::string::replace
                                                        ((ulong)&local_148,0,(char *)0x0,
                                                         (ulong)local_180);
                          }
                          else {
LAB_00132944:
                            plVar19 = (long *)std::__cxx11::string::_M_append
                                                        ((char *)&local_180,local_148._0_8_);
                          }
                          local_240 = &local_230;
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)&pBVar21->x = 0;
                          puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
                          local_220 = &local_210;
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)(puVar20 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          local_1c0 = &local_1b0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                            local_200 = &local_1f0;
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          local_1e0 = &local_1d0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                            local_1a0 = &local_190;
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)&local_1a0);
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if ((BRDPoint *)local_148._0_8_ != (BRDPoint *)&local_148.net) {
                            operator_delete((void *)local_148._0_8_,(long)local_148.net + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        pcStack_100 = (char *)((ulong)pcStack_100 & 0xffffffff);
                        uStack_f8 = (uint)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        iVar14 = (int)lVar23;
                        if (iVar14 < 0) {
                          local_260 = (BRDPoint)&local_250;
                          local_148.probe = 0x7a;
                          local_148.pos.x = 0;
                          BVar16 = (BRDPoint)
                                   std::__cxx11::string::_M_create
                                             ((ulong *)&local_260,(ulong)&local_148);
                          uVar12 = local_148._0_8_;
                          local_250.x = local_148.probe;
                          local_250.y = local_148.pos.x;
                          local_260 = BVar16;
                          memcpy((void *)BVar16,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,0x7a);
                          uVar13 = local_148._0_8_;
                          local_148.probe = (uint)uVar12;
                          local_148.pos.x = SUB84(uVar12,4);
                          local_258.x = local_148.probe;
                          local_258.y = local_148.pos.x;
                          *(undefined1 *)((long)BVar16 + uVar12) = 0;
                          local_148._0_8_ = uVar13;
                          puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                          pBVar21 = (BRDPoint *)(puVar20 + 2);
                          local_148._0_8_ = &local_148.net;
                          if ((BRDPoint *)*puVar20 == pBVar21) {
                            local_170 = *pBVar21;
                            lStack_168 = puVar20[3];
                            local_180 = &local_170;
                          }
                          else {
                            local_170 = *pBVar21;
                            local_180 = (BRDPoint *)*puVar20;
                          }
                          local_178 = *(BRDPoint *)(puVar20 + 1);
                          *puVar20 = pBVar21;
                          puVar20[1] = 0;
                          *(undefined1 *)(puVar20 + 2) = 0;
                          std::__cxx11::string::_M_construct((ulong)&local_148,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>
                                    ((char *)local_148._0_8_,3,0x69);
                          BVar65.x = 0xf;
                          BVar65.y = 0;
                          if (local_180 != &local_170) {
                            BVar65 = local_170;
                          }
                          if ((ulong)BVar65 < (ulong)(local_148._8_8_ + (long)local_178)) {
                            BVar66.x = 0xf;
                            BVar66.y = 0;
                            if ((BRDPoint *)local_148._0_8_ != (BRDPoint *)&local_148.net) {
                              BVar66 = (BRDPoint)local_148.net;
                            }
                            if ((ulong)BVar66 < (ulong)(local_148._8_8_ + (long)local_178))
                            goto LAB_00133d7d;
                            plVar19 = (long *)std::__cxx11::string::replace
                                                        ((ulong)&local_148,0,(char *)0x0,
                                                         (ulong)local_180);
                          }
                          else {
LAB_00133d7d:
                            plVar19 = (long *)std::__cxx11::string::_M_append
                                                        ((char *)&local_180,local_148._0_8_);
                          }
                          local_240 = &local_230;
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)&pBVar21->x = 0;
                          puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
                          local_220 = &local_210;
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)(puVar20 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          local_1c0 = &local_1b0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                            local_200 = &local_1f0;
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          local_1e0 = &local_1d0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                            local_1a0 = &local_190;
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)&local_1a0);
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if ((BRDPoint *)local_148._0_8_ != (BRDPoint *)&local_148.net) {
                            operator_delete((void *)local_148._0_8_,(long)local_148.net + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        uVar26 = (uint)(iVar14 == 2);
                        if (iVar14 == 1) {
                          uVar26 = 2;
                        }
                        pcStack_100 = (char *)CONCAT44(pcStack_100._4_4_,uVar26);
                        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                  (local_78,(value_type *)local_128);
                        pBVar90 = local_150;
                        BVar16 = (BRDPoint)&aStack_110;
                        if ((BRDPoint)local_128._8_8_ != BVar16) {
                          operator_delete((void *)local_128._8_8_,
                                          (ulong)(aStack_110._M_allocated_capacity + 1));
                          BVar16 = extraout_RAX_01;
                        }
                        goto switchD_0012e528_default;
                      case (BRDPoint)0x3:
                        if ((ulong)local_150->num_pins <=
                            (ulong)(((long)(local_150->pins).
                                           super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(local_150->pins).
                                           super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x6db6db6db6db6db7)) {
                          local_180 = &local_170;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_180,
                                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                     ,"");
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                            local_240 = &local_230;
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          local_260 = (BRDPoint)&local_250;
                          std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x75);
                          BVar43.x = 0xf;
                          BVar43.y = 0;
                          if (local_240 != &local_230) {
                            BVar43 = local_230;
                          }
                          if ((ulong)BVar43 < (ulong)((long)local_258 + local_238)) {
                            BVar44.x = 0xf;
                            BVar44.y = 0;
                            if (local_260 != (BRDPoint)&local_250) {
                              BVar44 = local_250;
                            }
                            if ((ulong)BVar44 < (ulong)((long)local_258 + local_238))
                            goto LAB_00130412;
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::replace
                                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                          }
                          else {
LAB_00130412:
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::_M_append
                                                ((char *)&local_240,(ulong)local_260);
                          }
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                            local_220 = &local_210;
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)plVar19 = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                            local_1c0 = &local_1b0;
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          local_200 = &local_1f0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          local_1e0 = &local_1d0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          local_1a0 = &local_190;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                          BVar16 = (BRDPoint)(pBVar21 + 2);
                          if (*pBVar21 == BVar16) {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                            local_128._0_8_ = (long)local_128 + 0x10;
                          }
                          else {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            local_128._0_8_ = *pBVar21;
                          }
                          local_128._8_8_ = pBVar21[1];
                          *pBVar21 = BVar16;
                          pBVar21[1].x = 0;
                          pBVar21[1].y = 0;
                          *(undefined1 *)&pBVar21[2].x = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                          if (local_128._0_8_ != (long)local_128 + 0x10) {
                            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                          }
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        local_128._0_4_ = 0;
                        local_128._4_4_ = 0;
                        local_128._8_8_ = (pointer)0x0;
                        local_128._16_8_ = local_128._16_8_ & 0xffffffff00000000;
                        aStack_110._M_allocated_capacity = 0x1ed23f;
                        aStack_110._8_8_ = 0.5;
                        pcStack_100 = (char *)0x0;
                        uStack_f8 = 0;
                        iStack_f4 = 0;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        local_128._0_4_ = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        local_128._4_4_ = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        if ((int)lVar23 < 0) {
                          local_260 = (BRDPoint)&local_250;
                          local_148.probe = 0x7a;
                          local_148.pos.x = 0;
                          BVar16 = (BRDPoint)
                                   std::__cxx11::string::_M_create
                                             ((ulong *)&local_260,(ulong)&local_148);
                          uVar12 = local_148._0_8_;
                          local_250.x = local_148.probe;
                          local_250.y = local_148.pos.x;
                          local_260 = BVar16;
                          memcpy((void *)BVar16,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,0x7a);
                          uVar13 = local_148._0_8_;
                          local_148.probe = (uint)uVar12;
                          local_148.pos.x = SUB84(uVar12,4);
                          local_258.x = local_148.probe;
                          local_258.y = local_148.pos.x;
                          *(undefined1 *)((long)BVar16 + uVar12) = 0;
                          local_148._0_8_ = uVar13;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_260);
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          local_148._0_8_ = &local_148.net;
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_170 = *pBVar21;
                            lStack_168 = plVar19[3];
                            local_180 = &local_170;
                          }
                          else {
                            local_170 = *pBVar21;
                            local_180 = (BRDPoint *)*plVar19;
                          }
                          local_178 = *(BRDPoint *)(plVar19 + 1);
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          std::__cxx11::string::_M_construct((ulong)&local_148,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>
                                    ((char *)local_148._0_8_,3,0x7a);
                          BVar51.x = 0xf;
                          BVar51.y = 0;
                          if (local_180 != &local_170) {
                            BVar51 = local_170;
                          }
                          if ((ulong)BVar51 < (ulong)(local_148._8_8_ + (long)local_178)) {
                            BVar52.x = 0xf;
                            BVar52.y = 0;
                            if ((BRDPoint *)local_148._0_8_ != (BRDPoint *)&local_148.net) {
                              BVar52 = (BRDPoint)local_148.net;
                            }
                            if ((ulong)BVar52 < (ulong)(local_148._8_8_ + (long)local_178))
                            goto LAB_00131482;
                            plVar19 = (long *)std::__cxx11::string::replace
                                                        ((ulong)&local_148,0,(char *)0x0,
                                                         (ulong)local_180);
                          }
                          else {
LAB_00131482:
                            plVar19 = (long *)std::__cxx11::string::_M_append
                                                        ((char *)&local_180,local_148._0_8_);
                          }
                          local_240 = &local_230;
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)&pBVar21->x = 0;
                          puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
                          local_220 = &local_210;
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)(puVar20 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          local_1c0 = &local_1b0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                            local_200 = &local_1f0;
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          local_1e0 = &local_1d0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                            local_1a0 = &local_190;
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)&local_1a0);
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if ((BRDPoint *)local_148._0_8_ != (BRDPoint *)&local_148.net) {
                            operator_delete((void *)local_148._0_8_,(long)local_148.net + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        local_bc = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        iVar14 = (int)lVar23;
                        if (iVar14 < 0) {
                          local_260 = (BRDPoint)&local_250;
                          local_148.probe = 0x7a;
                          local_148.pos.x = 0;
                          BVar16 = (BRDPoint)
                                   std::__cxx11::string::_M_create
                                             ((ulong *)&local_260,(ulong)&local_148);
                          uVar12 = local_148._0_8_;
                          local_250.x = local_148.probe;
                          local_250.y = local_148.pos.x;
                          local_260 = BVar16;
                          memcpy((void *)BVar16,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,0x7a);
                          uVar13 = local_148._0_8_;
                          local_148.probe = (uint)uVar12;
                          local_148.pos.x = SUB84(uVar12,4);
                          local_258.x = local_148.probe;
                          local_258.y = local_148.pos.x;
                          *(undefined1 *)((long)BVar16 + uVar12) = 0;
                          local_148._0_8_ = uVar13;
                          puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                          pBVar21 = (BRDPoint *)(puVar20 + 2);
                          local_148._0_8_ = &local_148.net;
                          if ((BRDPoint *)*puVar20 == pBVar21) {
                            local_170 = *pBVar21;
                            lStack_168 = puVar20[3];
                            local_180 = &local_170;
                          }
                          else {
                            local_170 = *pBVar21;
                            local_180 = (BRDPoint *)*puVar20;
                          }
                          local_178 = *(BRDPoint *)(puVar20 + 1);
                          *puVar20 = pBVar21;
                          puVar20[1] = 0;
                          *(undefined1 *)(puVar20 + 2) = 0;
                          std::__cxx11::string::_M_construct((ulong)&local_148,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>
                                    ((char *)local_148._0_8_,3,0x7b);
                          BVar63.x = 0xf;
                          BVar63.y = 0;
                          if (local_180 != &local_170) {
                            BVar63 = local_170;
                          }
                          if ((ulong)BVar63 < (ulong)(local_148._8_8_ + (long)local_178)) {
                            BVar64.x = 0xf;
                            BVar64.y = 0;
                            if ((BRDPoint *)local_148._0_8_ != (BRDPoint *)&local_148.net) {
                              BVar64 = (BRDPoint)local_148.net;
                            }
                            if ((ulong)BVar64 < (ulong)(local_148._8_8_ + (long)local_178))
                            goto LAB_001333c2;
                            plVar19 = (long *)std::__cxx11::string::replace
                                                        ((ulong)&local_148,0,(char *)0x0,
                                                         (ulong)local_180);
                          }
                          else {
LAB_001333c2:
                            plVar19 = (long *)std::__cxx11::string::_M_append
                                                        ((char *)&local_180,local_148._0_8_);
                          }
                          local_240 = &local_230;
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)&pBVar21->x = 0;
                          puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
                          local_220 = &local_210;
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)(puVar20 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          local_1c0 = &local_1b0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                            local_200 = &local_1f0;
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          local_1e0 = &local_1d0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                            local_1a0 = &local_190;
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)&local_1a0);
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if ((BRDPoint *)local_148._0_8_ != (BRDPoint *)&local_148.net) {
                            operator_delete((void *)local_148._0_8_,(long)local_148.net + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        pBVar90 = local_150;
                        if (iVar14 == 2) {
                          local_128._16_4_ = 1;
                        }
                        else if (iVar14 == 1) {
                          local_128._16_4_ = 2;
                        }
                        else {
                          local_128._16_8_ = (ulong)(uint)local_128._20_4_ << 0x20;
                        }
                        pBVar21 = (BRDPoint *)
                                  std::__detail::
                                  _Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::at((_Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_68,&local_bc);
                        aStack_110._M_allocated_capacity = (size_type)*pBVar21;
                        local_128._8_4_ = 1;
                        local_128._12_4_ = 0;
                        __position_00._M_current =
                             (pBVar90->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        if (__position_00._M_current ==
                            (pBVar90->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<BRDPin,std::allocator<BRDPin>>::
                          _M_realloc_insert<BRDPin_const&>
                                    (local_80,__position_00,(BRDPin *)local_128);
                          BVar16 = extraout_RAX_00;
                        }
                        else {
                          BVar16.y = iStack_f4;
                          BVar16.x = uStack_f8;
                          (__position_00._M_current)->name = (char *)BVar16;
                          (__position_00._M_current)->radius = (double)aStack_110._8_8_;
                          (__position_00._M_current)->snum = pcStack_100;
                          *(undefined8 *)&(__position_00._M_current)->side = local_128._16_8_;
                          (__position_00._M_current)->net = (char *)aStack_110._M_allocated_capacity
                          ;
                          ((__position_00._M_current)->pos).x = local_128._0_4_;
                          ((__position_00._M_current)->pos).y = local_128._4_4_;
                          (__position_00._M_current)->probe = 1;
                          (__position_00._M_current)->part = 0;
                          ppBVar2 = &(pBVar90->pins).
                                     super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                          *ppBVar2 = *ppBVar2 + 1;
                        }
                        goto switchD_0012e528_default;
                      case (BRDPoint)0x4:
                        if ((ulong)local_150->num_nails <=
                            (ulong)(((long)(local_150->nails).
                                           super__Vector_base<BRDNail,_std::allocator<BRDNail>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(local_150->nails).
                                           super__Vector_base<BRDNail,_std::allocator<BRDNail>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555)) {
                          local_180 = &local_170;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_180,
                                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                     ,"");
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                            local_240 = &local_230;
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          local_260 = (BRDPoint)&local_250;
                          std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x8f);
                          BVar39.x = 0xf;
                          BVar39.y = 0;
                          if (local_240 != &local_230) {
                            BVar39 = local_230;
                          }
                          if ((ulong)BVar39 < (ulong)((long)local_258 + local_238)) {
                            BVar40.x = 0xf;
                            BVar40.y = 0;
                            if (local_260 != (BRDPoint)&local_250) {
                              BVar40 = local_250;
                            }
                            if ((ulong)BVar40 < (ulong)((long)local_258 + local_238))
                            goto LAB_001302bd;
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::replace
                                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                          }
                          else {
LAB_001302bd:
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::_M_append
                                                ((char *)&local_240,(ulong)local_260);
                          }
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                            local_220 = &local_210;
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)plVar19 = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                            local_1c0 = &local_1b0;
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          local_200 = &local_1f0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          local_1e0 = &local_1d0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          local_1a0 = &local_190;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                          BVar16 = (BRDPoint)(pBVar21 + 2);
                          if (*pBVar21 == BVar16) {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                            local_128._0_8_ = (long)local_128 + 0x10;
                          }
                          else {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            local_128._0_8_ = *pBVar21;
                          }
                          local_128._8_8_ = pBVar21[1];
                          *pBVar21 = BVar16;
                          pBVar21[1].x = 0;
                          pBVar21[1].y = 0;
                          *(undefined1 *)&pBVar21[2].x = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                          if (local_128._0_8_ != (long)local_128 + 0x10) {
                            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                          }
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        local_148.probe = 0;
                        local_148.pos.x = 0;
                        local_148.pos.y = 0;
                        local_148.side = Both;
                        local_148.net = "UNCONNECTED";
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        if ((int)lVar23 < 0) {
                          local_260.x = 0x7a;
                          local_260.y = 0;
                          local_180 = &local_170;
                          pBVar21 = (BRDPoint *)
                                    std::__cxx11::string::_M_create
                                              ((ulong *)&local_180,(ulong)&local_260);
                          BVar16 = local_260;
                          local_170 = local_260;
                          local_180 = pBVar21;
                          memcpy(pBVar21,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,0x7a);
                          local_178 = BVar16;
                          *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                          local_240 = &local_230;
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          local_260 = (BRDPoint)&local_250;
                          std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x92);
                          BVar49.x = 0xf;
                          BVar49.y = 0;
                          if (local_240 != &local_230) {
                            BVar49 = local_230;
                          }
                          if ((ulong)BVar49 < (ulong)((long)local_258 + local_238)) {
                            BVar50.x = 0xf;
                            BVar50.y = 0;
                            if (local_260 != (BRDPoint)&local_250) {
                              BVar50 = local_250;
                            }
                            if ((ulong)BVar50 < (ulong)((long)local_258 + local_238))
                            goto LAB_00130a77;
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::replace
                                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                          }
                          else {
LAB_00130a77:
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::_M_append
                                                ((char *)&local_240,(ulong)local_260);
                          }
                          local_220 = &local_210;
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)plVar19 = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          local_1c0 = &local_1b0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                            local_200 = &local_1f0;
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                            local_1e0 = &local_1d0;
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          local_1a0 = &local_190;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                          BVar16 = (BRDPoint)(pBVar21 + 2);
                          if (*pBVar21 == BVar16) {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                            local_128._0_8_ = (long)local_128 + 0x10;
                          }
                          else {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            local_128._0_8_ = *pBVar21;
                          }
                          local_128._8_8_ = pBVar21[1];
                          *pBVar21 = BVar16;
                          pBVar21[1].x = 0;
                          pBVar21[1].y = 0;
                          *(undefined1 *)&pBVar21[2].x = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                          if (local_128._0_8_ != (long)local_128 + 0x10) {
                            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                          }
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        local_148.probe = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        local_148.pos.x = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        local_148.pos.y = (int)lVar23;
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        iVar14 = (int)lVar23;
                        if (iVar14 < 0) {
                          local_260.x = 0x7a;
                          local_260.y = 0;
                          local_180 = &local_170;
                          pBVar21 = (BRDPoint *)
                                    std::__cxx11::string::_M_create
                                              ((ulong *)&local_180,(ulong)&local_260);
                          BVar16 = local_260;
                          local_170 = local_260;
                          local_180 = pBVar21;
                          memcpy(pBVar21,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,0x7a);
                          local_178 = BVar16;
                          *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                          local_240 = &local_230;
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          local_260 = (BRDPoint)&local_250;
                          std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x95);
                          BVar61.x = 0xf;
                          BVar61.y = 0;
                          if (local_240 != &local_230) {
                            BVar61 = local_230;
                          }
                          if ((ulong)BVar61 < (ulong)((long)local_258 + local_238)) {
                            BVar62.x = 0xf;
                            BVar62.y = 0;
                            if (local_260 != (BRDPoint)&local_250) {
                              BVar62 = local_250;
                            }
                            if ((ulong)BVar62 < (ulong)((long)local_258 + local_238))
                            goto LAB_00132e95;
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::replace
                                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                          }
                          else {
LAB_00132e95:
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::_M_append
                                                ((char *)&local_240,(ulong)local_260);
                          }
                          local_220 = &local_210;
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)plVar19 = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          local_1c0 = &local_1b0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                            local_200 = &local_1f0;
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                            local_1e0 = &local_1d0;
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          local_1a0 = &local_190;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                          BVar16 = (BRDPoint)(pBVar21 + 2);
                          if (*pBVar21 == BVar16) {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                            local_128._0_8_ = (long)local_128 + 0x10;
                          }
                          else {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            local_128._0_8_ = *pBVar21;
                          }
                          local_128._8_8_ = pBVar21[1];
                          *pBVar21 = BVar16;
                          pBVar21[1].x = 0;
                          pBVar21[1].y = 0;
                          *(undefined1 *)&pBVar21[2].x = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                          if (local_128._0_8_ != (long)local_128 + 0x10) {
                            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                          }
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        p_Var6 = local_68._M_buckets[(ulong)(long)iVar14 % local_68._M_bucket_count]
                        ;
                        p_Var17 = (__node_base_ptr)0x0;
                        if ((p_Var6 != (__node_base_ptr)0x0) &&
                           (p_Var17 = p_Var6, p_Var84 = p_Var6->_M_nxt,
                           *(int *)&p_Var6->_M_nxt[1]._M_nxt != iVar14)) {
                          while (p_Var18 = p_Var84->_M_nxt, p_Var18 != (_Hash_node_base *)0x0) {
                            p_Var17 = (__node_base_ptr)0x0;
                            if (((ulong)(long)*(int *)&p_Var18[1]._M_nxt % local_68._M_bucket_count
                                 != (ulong)(long)iVar14 % local_68._M_bucket_count) ||
                               (p_Var17 = p_Var84, p_Var84 = p_Var18,
                               *(int *)&p_Var18[1]._M_nxt == iVar14)) goto LAB_00134186;
                          }
                          p_Var17 = (__node_base_ptr)0x0;
                        }
LAB_00134186:
                        if (p_Var17 == (__node_base_ptr)0x0) {
                          p_Var18 = (_Hash_node_base *)0x0;
                        }
                        else {
                          p_Var18 = p_Var17->_M_nxt;
                        }
                        if (p_Var18 == (_Hash_node_base *)0x0) {
                          local_148.net = "UNCONNECTED";
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"Missing net id: ",0x10);
                          plVar19 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar14);
                          std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
                          std::ostream::put((char)plVar19);
                          std::ostream::flush();
                        }
                        else {
                          local_148.net = *(char **)(p_Var18 + 2);
                        }
                        lVar23 = strtol((char *)local_160,(char **)&local_160,10);
                        if ((int)lVar23 < 0) {
                          local_260.x = 0x7a;
                          local_260.y = 0;
                          local_180 = &local_170;
                          pBVar21 = (BRDPoint *)
                                    std::__cxx11::string::_M_create
                                              ((ulong *)&local_180,(ulong)&local_260);
                          BVar16 = local_260;
                          local_170 = local_260;
                          local_180 = pBVar21;
                          memcpy(pBVar21,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,0x7a);
                          local_178 = BVar16;
                          *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                          local_240 = &local_230;
                          pBVar21 = (BRDPoint *)(plVar19 + 2);
                          if ((BRDPoint *)*plVar19 == pBVar21) {
                            local_230 = *pBVar21;
                            lStack_228 = plVar19[3];
                          }
                          else {
                            local_230 = *pBVar21;
                            local_240 = (BRDPoint *)*plVar19;
                          }
                          local_238 = plVar19[1];
                          *plVar19 = (long)pBVar21;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          local_260 = (BRDPoint)&local_250;
                          std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
                          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0x9f);
                          BVar67.x = 0xf;
                          BVar67.y = 0;
                          if (local_240 != &local_230) {
                            BVar67 = local_230;
                          }
                          if ((ulong)BVar67 < (ulong)((long)local_258 + local_238)) {
                            BVar68.x = 0xf;
                            BVar68.y = 0;
                            if (local_260 != (BRDPoint)&local_250) {
                              BVar68 = local_250;
                            }
                            if ((ulong)BVar68 < (ulong)((long)local_258 + local_238))
                            goto LAB_0013436b;
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::replace
                                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                          }
                          else {
LAB_0013436b:
                            puVar20 = (undefined8 *)
                                      std::__cxx11::string::_M_append
                                                ((char *)&local_240,(ulong)local_260);
                          }
                          local_220 = &local_210;
                          plVar19 = puVar20 + 2;
                          if ((long *)*puVar20 == plVar19) {
                            local_210 = *plVar19;
                            uStack_208 = puVar20[3];
                          }
                          else {
                            local_210 = *plVar19;
                            local_220 = (long *)*puVar20;
                          }
                          local_218 = puVar20[1];
                          *puVar20 = plVar19;
                          puVar20[1] = 0;
                          *(undefined1 *)plVar19 = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                          local_1c0 = &local_1b0;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1b0 = *plVar22;
                            lStack_1a8 = plVar19[3];
                          }
                          else {
                            local_1b0 = *plVar22;
                            local_1c0 = (long *)*plVar19;
                          }
                          local_1b8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1f0 = *plVar22;
                            lStack_1e8 = plVar19[3];
                            local_200 = &local_1f0;
                          }
                          else {
                            local_1f0 = *plVar22;
                            local_200 = (long *)*plVar19;
                          }
                          local_1f8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_1d0 = *plVar22;
                            lStack_1c8 = plVar19[3];
                            local_1e0 = &local_1d0;
                          }
                          else {
                            local_1d0 = *plVar22;
                            local_1e0 = (long *)*plVar19;
                          }
                          local_1d8 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                          local_1a0 = &local_190;
                          plVar22 = plVar19 + 2;
                          if ((long *)*plVar19 == plVar22) {
                            local_190 = *plVar22;
                            lStack_188 = plVar19[3];
                          }
                          else {
                            local_190 = *plVar22;
                            local_1a0 = (long *)*plVar19;
                          }
                          local_198 = plVar19[1];
                          *plVar19 = (long)plVar22;
                          plVar19[1] = 0;
                          *(undefined1 *)(plVar19 + 2) = 0;
                          pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                          BVar16 = (BRDPoint)(pBVar21 + 2);
                          if (*pBVar21 == BVar16) {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                            local_128._0_8_ = (long)local_128 + 0x10;
                          }
                          else {
                            local_128._16_8_ = *(undefined8 *)BVar16;
                            local_128._0_8_ = *pBVar21;
                          }
                          local_128._8_8_ = pBVar21[1];
                          *pBVar21 = BVar16;
                          pBVar21[1].x = 0;
                          pBVar21[1].y = 0;
                          *(undefined1 *)&pBVar21[2].x = 0;
                          std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                          if (local_128._0_8_ != (long)local_128 + 0x10) {
                            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                          }
                          if (local_1a0 != &local_190) {
                            operator_delete(local_1a0,local_190 + 1);
                          }
                          if (local_1e0 != &local_1d0) {
                            operator_delete(local_1e0,local_1d0 + 1);
                          }
                          if (local_200 != &local_1f0) {
                            operator_delete(local_200,local_1f0 + 1);
                          }
                          if (local_1c0 != &local_1b0) {
                            operator_delete(local_1c0,local_1b0 + 1);
                          }
                          if (local_220 != &local_210) {
                            operator_delete(local_220,local_210 + 1);
                          }
                          if (local_260 != (BRDPoint)&local_250) {
                            operator_delete((void *)local_260,(long)local_250 + 1);
                          }
                          if (local_240 != &local_230) {
                            operator_delete(local_240,(long)local_230 + 1);
                          }
                          if (local_180 != &local_170) {
                            operator_delete(local_180,(long)local_170 + 1);
                          }
                          SDL_LogError(1,"%s",local_158->name);
                        }
                        pBVar90 = local_150;
                        if ((int)lVar23 == 1) {
                          local_148.side = 2;
                        }
                        else {
                          local_148.side = 1;
                          local_148.pos.y = local_d8.x - local_148.pos.y;
                        }
                        __position_01._M_current =
                             (local_150->nails).
                             super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (__position_01._M_current ==
                            (local_150->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<BRDNail,std::allocator<BRDNail>>::
                          _M_realloc_insert<BRDNail_const&>(local_90,__position_01,&local_148);
                          BVar16 = extraout_RAX_02;
                        }
                        else {
                          (__position_01._M_current)->net = local_148.net;
                          (__position_01._M_current)->probe = local_148.probe;
                          ((__position_01._M_current)->pos).x = local_148.pos.x;
                          *(undefined8 *)&((__position_01._M_current)->pos).y = local_148._8_8_;
                          ppBVar3 = &(local_150->nails).
                                     super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                          *ppBVar3 = *ppBVar3 + 1;
                          BVar16 = (BRDPoint)local_148.net;
                        }
                      default:
                        goto switchD_0012e528_default;
                      }
                    }
                    local_160 = pbVar27 + 7;
                    BVar16 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
                    uVar26 = BVar16.x;
                    if ((int)uVar26 < 0) {
                      local_260.x = 0x7a;
                      local_260.y = 0;
                      local_180 = &local_170;
                      pBVar21 = (BRDPoint *)
                                std::__cxx11::string::_M_create
                                          ((ulong *)&local_180,(ulong)&local_260);
                      BVar16 = local_260;
                      local_170 = local_260;
                      local_180 = pBVar21;
                      memcpy(pBVar21,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,0x7a);
                      local_178 = BVar16;
                      *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
                      plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                      local_240 = &local_230;
                      pBVar21 = (BRDPoint *)(plVar19 + 2);
                      if ((BRDPoint *)*plVar19 == pBVar21) {
                        local_230 = *pBVar21;
                        lStack_228 = plVar19[3];
                      }
                      else {
                        local_230 = *pBVar21;
                        local_240 = (BRDPoint *)*plVar19;
                      }
                      local_238 = plVar19[1];
                      *plVar19 = (long)pBVar21;
                      plVar19[1] = 0;
                      *(undefined1 *)(plVar19 + 2) = 0;
                      local_260 = (BRDPoint)&local_250;
                      std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                      *(undefined2 *)local_260 = 0x3337;
                      BVar37.x = 0xf;
                      BVar37.y = 0;
                      if (local_240 != &local_230) {
                        BVar37 = local_230;
                      }
                      if ((ulong)BVar37 < (ulong)((long)local_258 + local_238)) {
                        BVar38.x = 0xf;
                        BVar38.y = 0;
                        if (local_260 != (BRDPoint)&local_250) {
                          BVar38 = local_250;
                        }
                        if ((ulong)BVar38 < (ulong)((long)local_258 + local_238)) goto LAB_0012fe63;
                        puVar20 = (undefined8 *)
                                  std::__cxx11::string::replace
                                            ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                      }
                      else {
LAB_0012fe63:
                        puVar20 = (undefined8 *)
                                  std::__cxx11::string::_M_append
                                            ((char *)&local_240,(ulong)local_260);
                      }
                      local_220 = &local_210;
                      plVar19 = puVar20 + 2;
                      if ((long *)*puVar20 == plVar19) {
                        local_210 = *plVar19;
                        uStack_208 = puVar20[3];
                      }
                      else {
                        local_210 = *plVar19;
                        local_220 = (long *)*puVar20;
                      }
                      local_218 = puVar20[1];
                      *puVar20 = plVar19;
                      puVar20[1] = 0;
                      *(undefined1 *)plVar19 = 0;
                      plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                      local_1c0 = &local_1b0;
                      plVar22 = plVar19 + 2;
                      if ((long *)*plVar19 == plVar22) {
                        local_1b0 = *plVar22;
                        lStack_1a8 = plVar19[3];
                      }
                      else {
                        local_1b0 = *plVar22;
                        local_1c0 = (long *)*plVar19;
                      }
                      local_1b8 = plVar19[1];
                      *plVar19 = (long)plVar22;
                      plVar19[1] = 0;
                      *(undefined1 *)(plVar19 + 2) = 0;
                      plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                      plVar22 = plVar19 + 2;
                      if ((long *)*plVar19 == plVar22) {
                        local_1f0 = *plVar22;
                        lStack_1e8 = plVar19[3];
                        local_200 = &local_1f0;
                      }
                      else {
                        local_1f0 = *plVar22;
                        local_200 = (long *)*plVar19;
                      }
                      local_1f8 = plVar19[1];
                      *plVar19 = (long)plVar22;
                      plVar19[1] = 0;
                      *(undefined1 *)(plVar19 + 2) = 0;
                      plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                      plVar22 = plVar19 + 2;
                      if ((long *)*plVar19 == plVar22) {
                        local_1d0 = *plVar22;
                        lStack_1c8 = plVar19[3];
                        local_1e0 = &local_1d0;
                      }
                      else {
                        local_1d0 = *plVar22;
                        local_1e0 = (long *)*plVar19;
                      }
                      local_1d8 = plVar19[1];
                      *plVar19 = (long)plVar22;
                      plVar19[1] = 0;
                      *(undefined1 *)(plVar19 + 2) = 0;
                      plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                      plVar22 = plVar19 + 2;
                      if ((long *)*plVar19 == plVar22) {
                        local_190 = *plVar22;
                        lStack_188 = plVar19[3];
                        local_1a0 = &local_190;
                      }
                      else {
                        local_190 = *plVar22;
                        local_1a0 = (long *)*plVar19;
                      }
                      local_198 = plVar19[1];
                      *plVar19 = (long)plVar22;
                      plVar19[1] = 0;
                      *(undefined1 *)(plVar19 + 2) = 0;
                      pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                      BVar16 = (BRDPoint)(pBVar21 + 2);
                      if (*pBVar21 == BVar16) {
                        local_128._16_8_ = *(undefined8 *)BVar16;
                        aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                        local_128._0_8_ = (long)local_128 + 0x10;
                      }
                      else {
                        local_128._16_8_ = *(undefined8 *)BVar16;
                        local_128._0_8_ = *pBVar21;
                      }
                      local_128._8_8_ = pBVar21[1];
                      *pBVar21 = BVar16;
                      pBVar21[1].x = 0;
                      pBVar21[1].y = 0;
                      *(undefined1 *)&pBVar21[2].x = 0;
                      std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                      if (local_128._0_8_ != (long)local_128 + 0x10) {
                        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                      }
                      if (local_1a0 != &local_190) {
                        operator_delete(local_1a0,local_190 + 1);
                      }
                      if (local_1e0 != &local_1d0) {
                        operator_delete(local_1e0,local_1d0 + 1);
                      }
                      if (local_200 != &local_1f0) {
                        operator_delete(local_200,local_1f0 + 1);
                      }
                      if (local_1c0 != &local_1b0) {
                        operator_delete(local_1c0,local_1b0 + 1);
                      }
                      if (local_220 != &local_210) {
                        operator_delete(local_220,local_210 + 1);
                      }
                      if (local_260 != (BRDPoint)&local_250) {
                        operator_delete((void *)local_260,(long)local_250 + 1);
                      }
                      if (local_240 != &local_230) {
                        operator_delete(local_240,(long)local_230 + 1);
                      }
                      if (local_180 != &local_170) {
                        operator_delete(local_180,(long)local_170 + 1);
                      }
                      BVar16 = (BRDPoint)SDL_LogError(1,"%s",local_158->name);
                    }
                    local_150->num_nails = uVar26;
                    iVar87 = 5;
                    pBVar90 = local_150;
                    goto switchD_0012e528_default;
                  }
                  local_160 = pbVar27 + 6;
                  BVar16 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
                  uVar26 = BVar16.x;
                  if ((int)uVar26 < 0) {
                    local_260.x = 0x7a;
                    local_260.y = 0;
                    local_180 = &local_170;
                    pBVar21 = (BRDPoint *)
                              std::__cxx11::string::_M_create((ulong *)&local_180,(ulong)&local_260)
                    ;
                    BVar16 = local_260;
                    local_170 = local_260;
                    local_180 = pBVar21;
                    memcpy(pBVar21,
                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                           ,0x7a);
                    local_178 = BVar16;
                    *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                    local_240 = &local_230;
                    pBVar21 = (BRDPoint *)(plVar19 + 2);
                    if ((BRDPoint *)*plVar19 == pBVar21) {
                      local_230 = *pBVar21;
                      lStack_228 = plVar19[3];
                    }
                    else {
                      local_230 = *pBVar21;
                      local_240 = (BRDPoint *)*plVar19;
                    }
                    local_238 = plVar19[1];
                    *plVar19 = (long)pBVar21;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    local_260 = (BRDPoint)&local_250;
                    std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                    *(undefined2 *)local_260 = 0x3736;
                    BVar35.x = 0xf;
                    BVar35.y = 0;
                    if (local_240 != &local_230) {
                      BVar35 = local_230;
                    }
                    if ((ulong)BVar35 < (ulong)((long)local_258 + local_238)) {
                      BVar36.x = 0xf;
                      BVar36.y = 0;
                      if (local_260 != (BRDPoint)&local_250) {
                        BVar36 = local_250;
                      }
                      if ((ulong)BVar36 < (ulong)((long)local_258 + local_238)) goto LAB_0012fa1c;
                      puVar20 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                    }
                    else {
LAB_0012fa1c:
                      puVar20 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260)
                      ;
                    }
                    local_220 = &local_210;
                    plVar19 = puVar20 + 2;
                    if ((long *)*puVar20 == plVar19) {
                      local_210 = *plVar19;
                      uStack_208 = puVar20[3];
                    }
                    else {
                      local_210 = *plVar19;
                      local_220 = (long *)*puVar20;
                    }
                    local_218 = puVar20[1];
                    *puVar20 = plVar19;
                    puVar20[1] = 0;
                    *(undefined1 *)plVar19 = 0;
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                    local_1c0 = &local_1b0;
                    plVar22 = plVar19 + 2;
                    if ((long *)*plVar19 == plVar22) {
                      local_1b0 = *plVar22;
                      lStack_1a8 = plVar19[3];
                    }
                    else {
                      local_1b0 = *plVar22;
                      local_1c0 = (long *)*plVar19;
                    }
                    local_1b8 = plVar19[1];
                    *plVar19 = (long)plVar22;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                    plVar22 = plVar19 + 2;
                    if ((long *)*plVar19 == plVar22) {
                      local_1f0 = *plVar22;
                      lStack_1e8 = plVar19[3];
                      local_200 = &local_1f0;
                    }
                    else {
                      local_1f0 = *plVar22;
                      local_200 = (long *)*plVar19;
                    }
                    local_1f8 = plVar19[1];
                    *plVar19 = (long)plVar22;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                    plVar22 = plVar19 + 2;
                    if ((long *)*plVar19 == plVar22) {
                      local_1d0 = *plVar22;
                      lStack_1c8 = plVar19[3];
                      local_1e0 = &local_1d0;
                    }
                    else {
                      local_1d0 = *plVar22;
                      local_1e0 = (long *)*plVar19;
                    }
                    local_1d8 = plVar19[1];
                    *plVar19 = (long)plVar22;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                    plVar22 = plVar19 + 2;
                    if ((long *)*plVar19 == plVar22) {
                      local_190 = *plVar22;
                      lStack_188 = plVar19[3];
                      local_1a0 = &local_190;
                    }
                    else {
                      local_190 = *plVar22;
                      local_1a0 = (long *)*plVar19;
                    }
                    local_198 = plVar19[1];
                    *plVar19 = (long)plVar22;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                    BVar16 = (BRDPoint)(pBVar21 + 2);
                    if (*pBVar21 == BVar16) {
                      local_128._16_8_ = *(undefined8 *)BVar16;
                      aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                      local_128._0_8_ = (long)local_128 + 0x10;
                    }
                    else {
                      local_128._16_8_ = *(undefined8 *)BVar16;
                      local_128._0_8_ = *pBVar21;
                    }
                    local_128._8_8_ = pBVar21[1];
                    *pBVar21 = BVar16;
                    pBVar21[1].x = 0;
                    pBVar21[1].y = 0;
                    *(undefined1 *)&pBVar21[2].x = 0;
                    std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                    if (local_128._0_8_ != (long)local_128 + 0x10) {
                      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                    }
                    if (local_1a0 != &local_190) {
                      operator_delete(local_1a0,local_190 + 1);
                    }
                    if (local_1e0 != &local_1d0) {
                      operator_delete(local_1e0,local_1d0 + 1);
                    }
                    if (local_200 != &local_1f0) {
                      operator_delete(local_200,local_1f0 + 1);
                    }
                    if (local_1c0 != &local_1b0) {
                      operator_delete(local_1c0,local_1b0 + 1);
                    }
                    if (local_220 != &local_210) {
                      operator_delete(local_220,local_210 + 1);
                    }
                    if (local_260 != (BRDPoint)&local_250) {
                      operator_delete((void *)local_260,(long)local_250 + 1);
                    }
                    if (local_240 != &local_230) {
                      operator_delete(local_240,(long)local_230 + 1);
                    }
                    if (local_180 != &local_170) {
                      operator_delete(local_180,(long)local_170 + 1);
                    }
                    BVar16 = (BRDPoint)SDL_LogError(1,"%s",local_158->name);
                  }
                  local_150->num_pins = uVar26;
                  iVar87 = 4;
                  pBVar90 = local_150;
                  goto switchD_0012e528_default;
                }
                local_160 = pbVar27 + 7;
                BVar16 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
                uVar26 = BVar16.x;
                if ((int)uVar26 < 0) {
                  local_260.x = 0x7a;
                  local_260.y = 0;
                  local_180 = &local_170;
                  pBVar21 = (BRDPoint *)
                            std::__cxx11::string::_M_create((ulong *)&local_180,(ulong)&local_260);
                  BVar16 = local_260;
                  local_170 = local_260;
                  local_180 = pBVar21;
                  memcpy(pBVar21,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,0x7a);
                  local_178 = BVar16;
                  *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
                  plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                  local_240 = &local_230;
                  pBVar21 = (BRDPoint *)(plVar19 + 2);
                  if ((BRDPoint *)*plVar19 == pBVar21) {
                    local_230 = *pBVar21;
                    lStack_228 = plVar19[3];
                  }
                  else {
                    local_230 = *pBVar21;
                    local_240 = (BRDPoint *)*plVar19;
                  }
                  local_238 = plVar19[1];
                  *plVar19 = (long)pBVar21;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  local_260 = (BRDPoint)&local_250;
                  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
                  *(undefined2 *)local_260 = 0x3136;
                  BVar33.x = 0xf;
                  BVar33.y = 0;
                  if (local_240 != &local_230) {
                    BVar33 = local_230;
                  }
                  if ((ulong)BVar33 < (ulong)((long)local_258 + local_238)) {
                    BVar34.x = 0xf;
                    BVar34.y = 0;
                    if (local_260 != (BRDPoint)&local_250) {
                      BVar34 = local_250;
                    }
                    if ((ulong)BVar34 < (ulong)((long)local_258 + local_238)) goto LAB_0012f357;
                    puVar20 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
                  }
                  else {
LAB_0012f357:
                    puVar20 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
                  }
                  local_220 = &local_210;
                  plVar19 = puVar20 + 2;
                  if ((long *)*puVar20 == plVar19) {
                    local_210 = *plVar19;
                    uStack_208 = puVar20[3];
                  }
                  else {
                    local_210 = *plVar19;
                    local_220 = (long *)*puVar20;
                  }
                  local_218 = puVar20[1];
                  *puVar20 = plVar19;
                  puVar20[1] = 0;
                  *(undefined1 *)plVar19 = 0;
                  plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_1c0 = &local_1b0;
                  plVar22 = plVar19 + 2;
                  if ((long *)*plVar19 == plVar22) {
                    local_1b0 = *plVar22;
                    lStack_1a8 = plVar19[3];
                  }
                  else {
                    local_1b0 = *plVar22;
                    local_1c0 = (long *)*plVar19;
                  }
                  local_1b8 = plVar19[1];
                  *plVar19 = (long)plVar22;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                  plVar22 = plVar19 + 2;
                  if ((long *)*plVar19 == plVar22) {
                    local_1f0 = *plVar22;
                    lStack_1e8 = plVar19[3];
                    local_200 = &local_1f0;
                  }
                  else {
                    local_1f0 = *plVar22;
                    local_200 = (long *)*plVar19;
                  }
                  local_1f8 = plVar19[1];
                  *plVar19 = (long)plVar22;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
                  plVar22 = plVar19 + 2;
                  if ((long *)*plVar19 == plVar22) {
                    local_1d0 = *plVar22;
                    lStack_1c8 = plVar19[3];
                    local_1e0 = &local_1d0;
                  }
                  else {
                    local_1d0 = *plVar22;
                    local_1e0 = (long *)*plVar19;
                  }
                  local_1d8 = plVar19[1];
                  *plVar19 = (long)plVar22;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  plVar22 = plVar19 + 2;
                  if ((long *)*plVar19 == plVar22) {
                    local_190 = *plVar22;
                    lStack_188 = plVar19[3];
                    local_1a0 = &local_190;
                  }
                  else {
                    local_190 = *plVar22;
                    local_1a0 = (long *)*plVar19;
                  }
                  local_198 = plVar19[1];
                  *plVar19 = (long)plVar22;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
                  BVar16 = (BRDPoint)(pBVar21 + 2);
                  if (*pBVar21 == BVar16) {
                    local_128._16_8_ = *(undefined8 *)BVar16;
                    aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                    local_128._0_8_ = (long)local_128 + 0x10;
                  }
                  else {
                    local_128._16_8_ = *(undefined8 *)BVar16;
                    local_128._0_8_ = *pBVar21;
                  }
                  local_128._8_8_ = pBVar21[1];
                  *pBVar21 = BVar16;
                  pBVar21[1].x = 0;
                  pBVar21[1].y = 0;
                  *(undefined1 *)&pBVar21[2].x = 0;
                  std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
                  if (local_128._0_8_ != (long)local_128 + 0x10) {
                    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
                  }
                  if (local_1a0 != &local_190) {
                    operator_delete(local_1a0,local_190 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_260 != (BRDPoint)&local_250) {
                    operator_delete((void *)local_260,(long)local_250 + 1);
                  }
                  if (local_240 != &local_230) {
                    operator_delete(local_240,(long)local_230 + 1);
                  }
                  if (local_180 != &local_170) {
                    operator_delete(local_180,(long)local_170 + 1);
                  }
                  BVar16 = (BRDPoint)SDL_LogError(1,"%s",local_158->name);
                }
                local_150->num_parts = uVar26;
                iVar87 = 3;
                pBVar90 = local_150;
                goto switchD_0012e528_default;
              }
              local_160 = pbVar27 + 6;
              local_e0 = (BRDPoint)strtol((char *)local_160,(char **)&local_160,10);
              iVar87 = 2;
              BVar16 = local_e0;
              if (-1 < local_e0.x) goto switchD_0012e528_default;
              local_260.x = 0x7a;
              local_260.y = 0;
              local_180 = &local_170;
              pBVar21 = (BRDPoint *)
                        std::__cxx11::string::_M_create((ulong *)&local_180,(ulong)&local_260);
              BVar16 = local_260;
              local_170 = local_260;
              local_180 = pBVar21;
              memcpy(pBVar21,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                     ,0x7a);
              local_178 = BVar16;
              *(undefined1 *)((long)&pBVar21->x + (long)BVar16) = 0;
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
              pBVar21 = (BRDPoint *)(plVar19 + 2);
              if ((BRDPoint *)*plVar19 == pBVar21) {
                local_230 = *pBVar21;
                lStack_228 = plVar19[3];
                local_240 = &local_230;
              }
              else {
                local_230 = *pBVar21;
                local_240 = (BRDPoint *)*plVar19;
              }
              local_238 = plVar19[1];
              *plVar19 = (long)pBVar21;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              local_260 = (BRDPoint)&local_250;
              std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
              *(undefined2 *)local_260 = 0x3535;
              BVar31.x = 0xf;
              BVar31.y = 0;
              if (local_240 != &local_230) {
                BVar31 = local_230;
              }
              if ((ulong)BVar31 < (ulong)((long)local_258 + local_238)) {
                BVar32.x = 0xf;
                BVar32.y = 0;
                if (local_260 != (BRDPoint)&local_250) {
                  BVar32 = local_250;
                }
                if ((ulong)BVar32 < (ulong)((long)local_258 + local_238)) goto LAB_0012ef02;
                puVar20 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
              }
              else {
LAB_0012ef02:
                puVar20 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
              }
              plVar19 = puVar20 + 2;
              if ((long *)*puVar20 == plVar19) {
                local_210 = *plVar19;
                uStack_208 = puVar20[3];
                local_220 = &local_210;
              }
              else {
                local_210 = *plVar19;
                local_220 = (long *)*puVar20;
              }
              local_218 = puVar20[1];
              *puVar20 = plVar19;
              puVar20[1] = 0;
              *(undefined1 *)plVar19 = 0;
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
              local_1c0 = &local_1b0;
              plVar22 = plVar19 + 2;
              if ((long *)*plVar19 == plVar22) {
                local_1b0 = *plVar22;
                lStack_1a8 = plVar19[3];
              }
              else {
                local_1b0 = *plVar22;
                local_1c0 = (long *)*plVar19;
              }
              local_1b8 = plVar19[1];
              *plVar19 = (long)plVar22;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
              local_200 = &local_1f0;
              plVar22 = plVar19 + 2;
              if ((long *)*plVar19 == plVar22) {
                local_1f0 = *plVar22;
                lStack_1e8 = plVar19[3];
              }
              else {
                local_1f0 = *plVar22;
                local_200 = (long *)*plVar19;
              }
              local_1f8 = plVar19[1];
              *plVar19 = (long)plVar22;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
              local_1e0 = &local_1d0;
              plVar22 = plVar19 + 2;
              if ((long *)*plVar19 == plVar22) {
                local_1d0 = *plVar22;
                lStack_1c8 = plVar19[3];
              }
              else {
                local_1d0 = *plVar22;
                local_1e0 = (long *)*plVar19;
              }
              local_1d8 = plVar19[1];
              *plVar19 = (long)plVar22;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
              local_1a0 = &local_190;
              plVar22 = plVar19 + 2;
              if ((long *)*plVar19 == plVar22) {
                local_190 = *plVar22;
                lStack_188 = plVar19[3];
              }
              else {
                local_190 = *plVar22;
                local_1a0 = (long *)*plVar19;
              }
              local_198 = plVar19[1];
              *plVar19 = (long)plVar22;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
              BVar16 = (BRDPoint)(pBVar21 + 2);
              if (*pBVar21 == BVar16) {
                local_128._16_8_ = *(undefined8 *)BVar16;
                aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
                local_128._0_8_ = (long)local_128 + 0x10;
              }
              else {
                local_128._16_8_ = *(undefined8 *)BVar16;
                local_128._0_8_ = *pBVar21;
              }
              local_128._8_8_ = pBVar21[1];
              *pBVar21 = BVar16;
              pBVar21[1].x = 0;
              pBVar21[1].y = 0;
              *(undefined1 *)&pBVar21[2].x = 0;
              std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
              if (local_128._0_8_ != (long)local_128 + 0x10) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
              }
              if (local_1a0 != &local_190) {
                operator_delete(local_1a0,local_190 + 1);
              }
              iVar87 = 2;
              if (local_1e0 != &local_1d0) {
                operator_delete(local_1e0,local_1d0 + 1);
              }
              if (local_200 != &local_1f0) {
                operator_delete(local_200,local_1f0 + 1);
              }
              if (local_1c0 != &local_1b0) {
                operator_delete(local_1c0,local_1b0 + 1);
              }
              if (local_220 != &local_210) {
                operator_delete(local_220,local_210 + 1);
              }
              if (local_260 != (BRDPoint)&local_250) {
                operator_delete((void *)local_260,(long)local_250 + 1);
              }
              if (local_240 != &local_230) {
                operator_delete(local_240,(long)local_230 + 1);
              }
              if (local_180 != &local_170) {
                operator_delete(local_180,(long)local_170 + 1);
              }
              BVar16 = (BRDPoint)SDL_LogError(1,"%s",local_158->name);
            }
          }
switchD_0012e528_default:
          ppcVar88 = ppcVar88 + 1;
        } while (ppcVar88 != (pointer)local_d0);
        pBVar85 = (BRDPinSide *)((ulong)local_e0 & 0xffffffff);
        local_e0 = (BRDPoint)CONCAT71(BVar16._1_7_,iVar87 != 0);
      }
      if ((long)(pBVar90->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pBVar90->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (ulong)pBVar90->num_format) {
        local_180 = &local_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
        pBVar90 = local_150;
        pBVar21 = (BRDPoint *)(plVar19 + 2);
        if ((BRDPoint *)*plVar19 == pBVar21) {
          local_230 = *pBVar21;
          lStack_228 = plVar19[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar21;
          local_240 = (BRDPoint *)*plVar19;
        }
        local_238 = plVar19[1];
        *plVar19 = (long)pBVar21;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xad);
        BVar73.x = 0xf;
        BVar73.y = 0;
        if (local_240 != &local_230) {
          BVar73 = local_230;
        }
        if ((ulong)BVar73 < (ulong)((long)local_258 + local_238)) {
          BVar74.x = 0xf;
          BVar74.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar74 = local_250;
          }
          if ((ulong)BVar74 < (ulong)((long)local_258 + local_238)) goto LAB_001356cb;
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_001356cb:
          puVar20 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar19 = puVar20 + 2;
        if ((long *)*puVar20 == plVar19) {
          local_210 = *plVar19;
          uStack_208 = puVar20[3];
        }
        else {
          local_210 = *plVar19;
          local_220 = (long *)*puVar20;
        }
        local_218 = puVar20[1];
        *puVar20 = plVar19;
        puVar20[1] = 0;
        *(undefined1 *)plVar19 = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_1c0 = &local_1b0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1b0 = *plVar22;
          lStack_1a8 = plVar19[3];
        }
        else {
          local_1b0 = *plVar22;
          local_1c0 = (long *)*plVar19;
        }
        local_1b8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1f0 = *plVar22;
          lStack_1e8 = plVar19[3];
          local_200 = &local_1f0;
        }
        else {
          local_1f0 = *plVar22;
          local_200 = (long *)*plVar19;
        }
        local_1f8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
        local_1e0 = &local_1d0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1d0 = *plVar22;
          lStack_1c8 = plVar19[3];
        }
        else {
          local_1d0 = *plVar22;
          local_1e0 = (long *)*plVar19;
        }
        local_1d8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_190 = *plVar22;
          lStack_188 = plVar19[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar22;
          local_1a0 = (long *)*plVar19;
        }
        local_198 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
        BVar16 = (BRDPoint)(pBVar21 + 2);
        if (*pBVar21 == BVar16) {
          local_128._16_8_ = *(undefined8 *)BVar16;
          aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
          local_128._0_8_ = (long)local_128 + 0x10;
        }
        else {
          local_128._16_8_ = *(undefined8 *)BVar16;
          local_128._0_8_ = *pBVar21;
        }
        local_128._8_8_ = pBVar21[1];
        *pBVar21 = BVar16;
        pBVar21[1].x = 0;
        pBVar21[1].y = 0;
        *(undefined1 *)&pBVar21[2].x = 0;
        local_d0 = pBVar85;
        std::__cxx11::string::operator=((string *)&pBVar90->error_msg,(string *)local_128);
        if (local_128._0_8_ != (long)local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,(long)local_170 + 1);
        }
        SDL_LogError(1,"%s",(pBVar90->error_msg)._M_dataplus._M_p);
        pBVar85 = local_d0;
      }
      if ((BRDPinSide *)local_68._M_element_count != pBVar85) {
        local_180 = &local_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
        pBVar90 = local_150;
        pBVar21 = (BRDPoint *)(plVar19 + 2);
        if ((BRDPoint *)*plVar19 == pBVar21) {
          local_230 = *pBVar21;
          lStack_228 = plVar19[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar21;
          local_240 = (BRDPoint *)*plVar19;
        }
        local_238 = plVar19[1];
        *plVar19 = (long)pBVar21;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xae);
        BVar75.x = 0xf;
        BVar75.y = 0;
        if (local_240 != &local_230) {
          BVar75 = local_230;
        }
        if ((ulong)BVar75 < (ulong)((long)local_258 + local_238)) {
          BVar76.x = 0xf;
          BVar76.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar76 = local_250;
          }
          if ((ulong)BVar76 < (ulong)((long)local_258 + local_238)) goto LAB_00135ed5;
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_00135ed5:
          puVar20 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar19 = puVar20 + 2;
        if ((long *)*puVar20 == plVar19) {
          local_210 = *plVar19;
          uStack_208 = puVar20[3];
        }
        else {
          local_210 = *plVar19;
          local_220 = (long *)*puVar20;
        }
        local_218 = puVar20[1];
        *puVar20 = plVar19;
        puVar20[1] = 0;
        *(undefined1 *)plVar19 = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_1c0 = &local_1b0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1b0 = *plVar22;
          lStack_1a8 = plVar19[3];
        }
        else {
          local_1b0 = *plVar22;
          local_1c0 = (long *)*plVar19;
        }
        local_1b8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_200 = &local_1f0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1f0 = *plVar22;
          lStack_1e8 = plVar19[3];
        }
        else {
          local_1f0 = *plVar22;
          local_200 = (long *)*plVar19;
        }
        local_1f8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1d0 = *plVar22;
          lStack_1c8 = plVar19[3];
          local_1e0 = &local_1d0;
        }
        else {
          local_1d0 = *plVar22;
          local_1e0 = (long *)*plVar19;
        }
        local_1d8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_190 = *plVar22;
          lStack_188 = plVar19[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar22;
          local_1a0 = (long *)*plVar19;
        }
        local_198 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
        BVar16 = (BRDPoint)(pBVar21 + 2);
        if (*pBVar21 == BVar16) {
          local_128._16_8_ = *(undefined8 *)BVar16;
          aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
          local_128._0_8_ = (long)local_128 + 0x10;
        }
        else {
          local_128._16_8_ = *(undefined8 *)BVar16;
          local_128._0_8_ = *pBVar21;
        }
        local_128._8_8_ = pBVar21[1];
        *pBVar21 = BVar16;
        pBVar21[1].x = 0;
        pBVar21[1].y = 0;
        *(undefined1 *)&pBVar21[2].x = 0;
        std::__cxx11::string::operator=((string *)&pBVar90->error_msg,(string *)local_128);
        if (local_128._0_8_ != (long)local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,(long)local_170 + 1);
        }
        SDL_LogError(1,"%s",(pBVar90->error_msg)._M_dataplus._M_p);
      }
      if (((long)(local_150->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(local_150->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 -
          (ulong)local_150->num_parts != 0) {
        local_180 = &local_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
        pBVar90 = local_150;
        pBVar21 = (BRDPoint *)(plVar19 + 2);
        if ((BRDPoint *)*plVar19 == pBVar21) {
          local_230 = *pBVar21;
          lStack_228 = plVar19[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar21;
          local_240 = (BRDPoint *)*plVar19;
        }
        local_238 = plVar19[1];
        *plVar19 = (long)pBVar21;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xaf);
        BVar77.x = 0xf;
        BVar77.y = 0;
        if (local_240 != &local_230) {
          BVar77 = local_230;
        }
        if ((ulong)BVar77 < (ulong)((long)local_258 + local_238)) {
          BVar78.x = 0xf;
          BVar78.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar78 = local_250;
          }
          if ((ulong)BVar78 < (ulong)((long)local_258 + local_238)) goto LAB_00136372;
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_00136372:
          puVar20 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar19 = puVar20 + 2;
        if ((long *)*puVar20 == plVar19) {
          local_210 = *plVar19;
          uStack_208 = puVar20[3];
        }
        else {
          local_210 = *plVar19;
          local_220 = (long *)*puVar20;
        }
        local_218 = puVar20[1];
        *puVar20 = plVar19;
        puVar20[1] = 0;
        *(undefined1 *)plVar19 = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_1c0 = &local_1b0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1b0 = *plVar22;
          lStack_1a8 = plVar19[3];
        }
        else {
          local_1b0 = *plVar22;
          local_1c0 = (long *)*plVar19;
        }
        local_1b8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_200 = &local_1f0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1f0 = *plVar22;
          lStack_1e8 = plVar19[3];
        }
        else {
          local_1f0 = *plVar22;
          local_200 = (long *)*plVar19;
        }
        local_1f8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1d0 = *plVar22;
          lStack_1c8 = plVar19[3];
          local_1e0 = &local_1d0;
        }
        else {
          local_1d0 = *plVar22;
          local_1e0 = (long *)*plVar19;
        }
        local_1d8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_190 = *plVar22;
          lStack_188 = plVar19[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar22;
          local_1a0 = (long *)*plVar19;
        }
        local_198 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
        BVar16 = (BRDPoint)(pBVar21 + 2);
        if (*pBVar21 == BVar16) {
          local_128._16_8_ = *(undefined8 *)BVar16;
          aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
          local_128._0_8_ = (long)local_128 + 0x10;
        }
        else {
          local_128._16_8_ = *(undefined8 *)BVar16;
          local_128._0_8_ = *pBVar21;
        }
        local_128._8_8_ = pBVar21[1];
        *pBVar21 = BVar16;
        pBVar21[1].x = 0;
        pBVar21[1].y = 0;
        *(undefined1 *)&pBVar21[2].x = 0;
        std::__cxx11::string::operator=((string *)&pBVar90->error_msg,(string *)local_128);
        if (local_128._0_8_ != (long)local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,(long)local_170 + 1);
        }
        SDL_LogError(1,"%s",(pBVar90->error_msg)._M_dataplus._M_p);
      }
      if (((long)(local_150->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(local_150->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 -
          (ulong)local_150->num_pins != 0) {
        local_180 = &local_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
        pBVar90 = local_150;
        pBVar21 = (BRDPoint *)(plVar19 + 2);
        if ((BRDPoint *)*plVar19 == pBVar21) {
          local_230 = *pBVar21;
          lStack_228 = plVar19[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar21;
          local_240 = (BRDPoint *)*plVar19;
        }
        local_238 = plVar19[1];
        *plVar19 = (long)pBVar21;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xb0);
        BVar79.x = 0xf;
        BVar79.y = 0;
        if (local_240 != &local_230) {
          BVar79 = local_230;
        }
        if ((ulong)BVar79 < (ulong)((long)local_258 + local_238)) {
          BVar80.x = 0xf;
          BVar80.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar80 = local_250;
          }
          if ((ulong)BVar80 < (ulong)((long)local_258 + local_238)) goto LAB_0013680f;
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_0013680f:
          puVar20 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar19 = puVar20 + 2;
        if ((long *)*puVar20 == plVar19) {
          local_210 = *plVar19;
          uStack_208 = puVar20[3];
        }
        else {
          local_210 = *plVar19;
          local_220 = (long *)*puVar20;
        }
        local_218 = puVar20[1];
        *puVar20 = plVar19;
        puVar20[1] = 0;
        *(undefined1 *)plVar19 = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1b0 = *plVar22;
          lStack_1a8 = plVar19[3];
          local_1c0 = &local_1b0;
        }
        else {
          local_1b0 = *plVar22;
          local_1c0 = (long *)*plVar19;
        }
        local_1b8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_200 = &local_1f0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1f0 = *plVar22;
          lStack_1e8 = plVar19[3];
        }
        else {
          local_1f0 = *plVar22;
          local_200 = (long *)*plVar19;
        }
        local_1f8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
        local_1e0 = &local_1d0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1d0 = *plVar22;
          lStack_1c8 = plVar19[3];
        }
        else {
          local_1d0 = *plVar22;
          local_1e0 = (long *)*plVar19;
        }
        local_1d8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_190 = *plVar22;
          lStack_188 = plVar19[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar22;
          local_1a0 = (long *)*plVar19;
        }
        local_198 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
        BVar16 = (BRDPoint)(pBVar21 + 2);
        if (*pBVar21 == BVar16) {
          local_128._16_8_ = *(undefined8 *)BVar16;
          aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
          local_128._0_8_ = (long)local_128 + 0x10;
        }
        else {
          local_128._16_8_ = *(undefined8 *)BVar16;
          local_128._0_8_ = *pBVar21;
        }
        local_128._8_8_ = pBVar21[1];
        *pBVar21 = BVar16;
        pBVar21[1].x = 0;
        pBVar21[1].y = 0;
        *(undefined1 *)&pBVar21[2].x = 0;
        std::__cxx11::string::operator=((string *)&pBVar90->error_msg,(string *)local_128);
        if (local_128._0_8_ != (long)local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,(long)local_170 + 1);
        }
        SDL_LogError(1,"%s",(pBVar90->error_msg)._M_dataplus._M_p);
      }
      if (((long)(local_150->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(local_150->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
          (ulong)local_150->num_nails != 0) {
        local_180 = &local_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,"");
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
        pBVar90 = local_150;
        pBVar21 = (BRDPoint *)(plVar19 + 2);
        if ((BRDPoint *)*plVar19 == pBVar21) {
          local_230 = *pBVar21;
          lStack_228 = plVar19[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *pBVar21;
          local_240 = (BRDPoint *)*plVar19;
        }
        local_238 = plVar19[1];
        *plVar19 = (long)pBVar21;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_260 = (BRDPoint)&local_250;
        std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,3,0xb1);
        BVar81.x = 0xf;
        BVar81.y = 0;
        if (local_240 != &local_230) {
          BVar81 = local_230;
        }
        if ((ulong)BVar81 < (ulong)((long)local_258 + local_238)) {
          BVar82.x = 0xf;
          BVar82.y = 0;
          if (local_260 != (BRDPoint)&local_250) {
            BVar82 = local_250;
          }
          if ((ulong)BVar82 < (ulong)((long)local_258 + local_238)) goto LAB_00136caf;
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_00136caf:
          puVar20 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        }
        local_220 = &local_210;
        plVar19 = puVar20 + 2;
        if ((long *)*puVar20 == plVar19) {
          local_210 = *plVar19;
          uStack_208 = puVar20[3];
        }
        else {
          local_210 = *plVar19;
          local_220 = (long *)*puVar20;
        }
        local_218 = puVar20[1];
        *puVar20 = plVar19;
        puVar20[1] = 0;
        *(undefined1 *)plVar19 = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_1c0 = &local_1b0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1b0 = *plVar22;
          lStack_1a8 = plVar19[3];
        }
        else {
          local_1b0 = *plVar22;
          local_1c0 = (long *)*plVar19;
        }
        local_1b8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_200 = &local_1f0;
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1f0 = *plVar22;
          lStack_1e8 = plVar19[3];
        }
        else {
          local_1f0 = *plVar22;
          local_200 = (long *)*plVar19;
        }
        local_1f8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_1d0 = *plVar22;
          lStack_1c8 = plVar19[3];
          local_1e0 = &local_1d0;
        }
        else {
          local_1d0 = *plVar22;
          local_1e0 = (long *)*plVar19;
        }
        local_1d8 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        plVar22 = plVar19 + 2;
        if ((long *)*plVar19 == plVar22) {
          local_190 = *plVar22;
          lStack_188 = plVar19[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar22;
          local_1a0 = (long *)*plVar19;
        }
        local_198 = plVar19[1];
        *plVar19 = (long)plVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
        BVar16 = (BRDPoint)(pBVar21 + 2);
        if (*pBVar21 == BVar16) {
          local_128._16_8_ = *(undefined8 *)BVar16;
          aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
          local_128._0_8_ = (long)local_128 + 0x10;
        }
        else {
          local_128._16_8_ = *(undefined8 *)BVar16;
          local_128._0_8_ = *pBVar21;
        }
        local_128._8_8_ = pBVar21[1];
        *pBVar21 = BVar16;
        pBVar21[1].x = 0;
        pBVar21[1].y = 0;
        *(undefined1 *)&pBVar21[2].x = 0;
        std::__cxx11::string::operator=((string *)&pBVar90->error_msg,(string *)local_128);
        if (local_128._0_8_ != (long)local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,local_1d0 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_260 != (BRDPoint)&local_250) {
          operator_delete((void *)local_260,(long)local_250 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(long)local_230 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,(long)local_170 + 1);
        }
        SDL_LogError(1,"%s",(pBVar90->error_msg)._M_dataplus._M_p);
      }
      this_00 = &local_150->parts;
      pBVar7 = (local_150->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar23 = (long)(local_150->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar7;
      if (lVar23 != 0) {
        lVar23 = (lVar23 >> 3) * -0x71c71c71c71c71c7;
        pBVar8 = (local_150->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar9 = (local_150->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pBVar10 = (local_150->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pBVar11 = (local_150->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_c8 = &pBVar8[1].end_of_pins;
        local_d0 = &pBVar11->side;
        lVar86 = 0;
        iVar87 = 0;
        do {
          iVar14 = local_d8.x;
          if (pBVar7[lVar86].mounting_side == Bottom) {
            pBVar7[lVar86].p1.y = iVar14 - pBVar7[lVar86].p1.y;
            pBVar8[lVar86].p2.y = iVar14 - pBVar8[lVar86].p2.y;
          }
          uVar26 = (int)((ulong)((long)pBVar10 - (long)pBVar11) >> 3) * -0x49249249;
          if (lVar86 != ((long)pBVar9 - (long)pBVar8 >> 3) * -0x71c71c71c71c71c7 + -1) {
            uVar26 = local_c8[lVar86 * 0x12];
          }
          bVar25 = true;
          if (iVar87 < (int)uVar26) {
            pBVar89 = &(this_00->super__Vector_base<BRDPart,_std::allocator<BRDPart>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar86].mounting_side;
            pBVar85 = local_d0 + (long)iVar87 * 0xe;
            bVar25 = true;
            lVar83 = 0;
            do {
              pBVar85[-1] = (int)lVar86 + 1;
              if (*pBVar85 != Top) {
                pBVar85[-3] = iVar14 - pBVar85[-3];
              }
              if (*pBVar85 == Bottom) {
                if (*pBVar89 == Bottom) goto LAB_00137173;
              }
              else if ((*pBVar85 == Top) && (*pBVar89 == Top)) {
LAB_00137173:
                bVar25 = false;
              }
              pBVar85 = pBVar85 + 0xe;
              lVar83 = lVar83 + -1;
            } while ((long)iVar87 - (long)(int)uVar26 != lVar83);
            iVar87 = iVar87 - (int)lVar83;
          }
          if (bVar25) {
            pBVar8[lVar86].part_type = ThroughHole;
            pBVar8[lVar86].mounting_side = Both;
          }
          else {
            pBVar8[lVar86].part_type = SMD;
          }
          lVar86 = lVar86 + 1;
          local_158 = pBVar7;
        } while (lVar86 != lVar23 + (ulong)(lVar23 == 0));
      }
      iVar87 = 2;
      do {
        local_128._16_8_ = 0;
        aStack_110._M_allocated_capacity = aStack_110._M_allocated_capacity & 0xffffffffffffff00;
        iStack_f0 = 0;
        BStack_ec.x = 0;
        BStack_ec.y = 0;
        iStack_f4 = 0;
        local_128._0_8_ = (long)"Did you mean..." + 0xc;
        pcStack_100 = (char *)(ulong)((iVar87 != 2) + 1);
        uStack_f8 = 0;
        local_128._8_8_ = &aStack_110;
        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back(this_00,(value_type *)local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._8_8_ != &aStack_110) {
          operator_delete((void *)local_128._8_8_,(ulong)(aStack_110._M_allocated_capacity + 1));
        }
        iVar87 = iVar87 + -1;
      } while (iVar87 != 0);
      BRDFileBase::AddNailsAsPins(local_150);
      local_150->valid = local_e0.x._0_1_;
      if (local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      goto LAB_0013729f;
    }
    local_180 = &local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
               ,"");
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
    pBVar21 = (BRDPoint *)(plVar19 + 2);
    if ((BRDPoint *)*plVar19 == pBVar21) {
      local_230 = *pBVar21;
      lStack_228 = plVar19[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *pBVar21;
      local_240 = (BRDPoint *)*plVar19;
    }
    local_238 = plVar19[1];
    *plVar19 = (long)pBVar21;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_260 = (BRDPoint)&local_250;
    std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
    *(undefined2 *)local_260 = 0x3332;
    BVar71.x = 0xf;
    BVar71.y = 0;
    if (local_240 != &local_230) {
      BVar71 = local_230;
    }
    if ((ulong)BVar71 < (ulong)((long)local_258 + local_238)) {
      BVar72.x = 0xf;
      BVar72.y = 0;
      if (local_260 != (BRDPoint)&local_250) {
        BVar72 = local_250;
      }
      if ((ulong)BVar72 < (ulong)((long)local_258 + local_238)) goto LAB_0013561f;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
    }
    else {
LAB_0013561f:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
    }
    local_220 = &local_210;
    plVar19 = puVar20 + 2;
    if ((long *)*puVar20 == plVar19) {
      local_210 = *plVar19;
      uStack_208 = puVar20[3];
    }
    else {
      local_210 = *plVar19;
      local_220 = (long *)*puVar20;
    }
    local_218 = puVar20[1];
    *puVar20 = plVar19;
    puVar20[1] = 0;
    *(undefined1 *)plVar19 = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_1c0 = &local_1b0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1b0 = *plVar22;
      lStack_1a8 = plVar19[3];
    }
    else {
      local_1b0 = *plVar22;
      local_1c0 = (long *)*plVar19;
    }
    local_1b8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    local_200 = &local_1f0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1f0 = *plVar22;
      lStack_1e8 = plVar19[3];
    }
    else {
      local_1f0 = *plVar22;
      local_200 = (long *)*plVar19;
    }
    local_1f8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_1e0 = &local_1d0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1d0 = *plVar22;
      lStack_1c8 = plVar19[3];
    }
    else {
      local_1d0 = *plVar22;
      local_1e0 = (long *)*plVar19;
    }
    local_1d8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_190 = *plVar22;
      lStack_188 = plVar19[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar22;
      local_1a0 = (long *)*plVar19;
    }
    local_198 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
    BVar16 = (BRDPoint)(pBVar21 + 2);
    if (*pBVar21 == BVar16) {
      local_128._16_8_ = *(undefined8 *)BVar16;
      aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
      local_128._0_8_ = (long)local_128 + 0x10;
    }
    else {
      local_128._16_8_ = *(undefined8 *)BVar16;
      local_128._0_8_ = *pBVar21;
    }
    local_128._8_8_ = pBVar21[1];
    *pBVar21 = BVar16;
    pBVar21[1].x = 0;
    pBVar21[1].y = 0;
    *(undefined1 *)&pBVar21[2].x = 0;
    psVar4 = &local_150->error_msg;
    std::__cxx11::string::operator=((string *)psVar4,(string *)local_128);
    if (local_128._0_8_ != (long)local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_260 != (BRDPoint)&local_250) {
      operator_delete((void *)local_260,(long)local_250 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,(long)local_230 + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,(long)local_170 + 1);
    }
    SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
    goto LAB_0013729f;
  }
  local_180 = &local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
             ,"");
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
  pBVar21 = (BRDPoint *)(plVar19 + 2);
  if ((BRDPoint *)*plVar19 == pBVar21) {
    local_230 = *pBVar21;
    lStack_228 = plVar19[3];
    local_240 = &local_230;
  }
  else {
    local_230 = *pBVar21;
    local_240 = (BRDPoint *)*plVar19;
  }
  local_238 = plVar19[1];
  *plVar19 = (long)pBVar21;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  local_260 = (BRDPoint)&local_250;
  std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
  *(undefined2 *)local_260 = 0x3032;
  BVar69.x = 0xf;
  BVar69.y = 0;
  if (local_240 != &local_230) {
    BVar69 = local_230;
  }
  if ((ulong)BVar69 < (ulong)((long)local_258 + local_238)) {
    BVar70.x = 0xf;
    BVar70.y = 0;
    if (local_260 != (BRDPoint)&local_250) {
      BVar70 = local_250;
    }
    if ((ulong)BVar70 < (ulong)((long)local_258 + local_238)) goto LAB_00135178;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
  }
  else {
LAB_00135178:
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
  }
  local_220 = &local_210;
  plVar19 = puVar20 + 2;
  if ((long *)*puVar20 == plVar19) {
    local_210 = *plVar19;
    uStack_208 = puVar20[3];
  }
  else {
    local_210 = *plVar19;
    local_220 = (long *)*puVar20;
  }
  local_218 = puVar20[1];
  *puVar20 = plVar19;
  puVar20[1] = 0;
  *(undefined1 *)plVar19 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_1c0 = &local_1b0;
  plVar22 = plVar19 + 2;
  if ((long *)*plVar19 == plVar22) {
    local_1b0 = *plVar22;
    lStack_1a8 = plVar19[3];
  }
  else {
    local_1b0 = *plVar22;
    local_1c0 = (long *)*plVar19;
  }
  local_1b8 = plVar19[1];
  *plVar19 = (long)plVar22;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_200 = &local_1f0;
  plVar22 = plVar19 + 2;
  if ((long *)*plVar19 == plVar22) {
    local_1f0 = *plVar22;
    lStack_1e8 = plVar19[3];
  }
  else {
    local_1f0 = *plVar22;
    local_200 = (long *)*plVar19;
  }
  local_1f8 = plVar19[1];
  *plVar19 = (long)plVar22;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_1e0 = &local_1d0;
  plVar22 = plVar19 + 2;
  if ((long *)*plVar19 == plVar22) {
    local_1d0 = *plVar22;
    lStack_1c8 = plVar19[3];
  }
  else {
    local_1d0 = *plVar22;
    local_1e0 = (long *)*plVar19;
  }
  local_1d8 = plVar19[1];
  *plVar19 = (long)plVar22;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  plVar22 = plVar19 + 2;
  if ((long *)*plVar19 == plVar22) {
    local_190 = *plVar22;
    lStack_188 = plVar19[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *plVar22;
    local_1a0 = (long *)*plVar19;
  }
  local_198 = plVar19[1];
  *plVar19 = (long)plVar22;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
  BVar16 = (BRDPoint)(pBVar21 + 2);
  if (*pBVar21 == BVar16) {
    local_128._16_8_ = *(undefined8 *)BVar16;
    aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
    local_128._0_8_ = (long)local_128 + 0x10;
  }
  else {
    local_128._16_8_ = *(undefined8 *)BVar16;
    local_128._0_8_ = *pBVar21;
  }
  local_128._8_8_ = pBVar21[1];
  *pBVar21 = BVar16;
  pBVar21[1].x = 0;
  pBVar21[1].y = 0;
  *(undefined1 *)&pBVar21[2].x = 0;
  psVar4 = &local_150->error_msg;
  std::__cxx11::string::operator=((string *)psVar4,(string *)local_128);
  if (local_128._0_8_ != (long)local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if (local_260 != (BRDPoint)&local_250) {
    operator_delete((void *)local_260,(long)local_250 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,(long)local_230 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,(long)local_170 + 1);
  }
  SDL_LogError(1,"%s",(psVar4->_M_dataplus)._M_p);
LAB_0013729f:
  std::
  _Hashtable<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
switchD_0012e528_caseD_0:
  if ((ulong)local_150->num_format <=
      (ulong)((long)(local_150->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_150->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_180 = &local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
               ,"");
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
    pBVar21 = (BRDPoint *)(plVar19 + 2);
    if ((BRDPoint *)*plVar19 == pBVar21) {
      local_230 = *pBVar21;
      lStack_228 = plVar19[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *pBVar21;
      local_240 = (BRDPoint *)*plVar19;
    }
    local_238 = plVar19[1];
    *plVar19 = (long)pBVar21;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_260 = (BRDPoint)&local_250;
    std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
    *(undefined2 *)local_260 = 0x3937;
    BVar45.x = 0xf;
    BVar45.y = 0;
    if (local_240 != &local_230) {
      BVar45 = local_230;
    }
    if ((ulong)BVar45 < (ulong)((long)local_258 + local_238)) {
      BVar46.x = 0xf;
      BVar46.y = 0;
      if (local_260 != (BRDPoint)&local_250) {
        BVar46 = local_250;
      }
      if ((ulong)BVar46 < (ulong)((long)local_258 + local_238)) goto LAB_001304b7;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
    }
    else {
LAB_001304b7:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
    }
    plVar19 = puVar20 + 2;
    if ((long *)*puVar20 == plVar19) {
      local_210 = *plVar19;
      uStack_208 = puVar20[3];
      local_220 = &local_210;
    }
    else {
      local_210 = *plVar19;
      local_220 = (long *)*puVar20;
    }
    local_218 = puVar20[1];
    *puVar20 = plVar19;
    puVar20[1] = 0;
    *(undefined1 *)plVar19 = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_1c0 = &local_1b0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1b0 = *plVar22;
      lStack_1a8 = plVar19[3];
    }
    else {
      local_1b0 = *plVar22;
      local_1c0 = (long *)*plVar19;
    }
    local_1b8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    local_200 = &local_1f0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1f0 = *plVar22;
      lStack_1e8 = plVar19[3];
    }
    else {
      local_1f0 = *plVar22;
      local_200 = (long *)*plVar19;
    }
    local_1f8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_1e0 = &local_1d0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1d0 = *plVar22;
      lStack_1c8 = plVar19[3];
    }
    else {
      local_1d0 = *plVar22;
      local_1e0 = (long *)*plVar19;
    }
    local_1d8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    local_1a0 = &local_190;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_190 = *plVar22;
      lStack_188 = plVar19[3];
    }
    else {
      local_190 = *plVar22;
      local_1a0 = (long *)*plVar19;
    }
    local_198 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
    BVar16 = (BRDPoint)(pBVar21 + 2);
    if (*pBVar21 == BVar16) {
      local_128._16_8_ = *(undefined8 *)BVar16;
      aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
      local_128._0_8_ = (long)local_128 + 0x10;
    }
    else {
      local_128._16_8_ = *(undefined8 *)BVar16;
      local_128._0_8_ = *pBVar21;
    }
    local_128._8_8_ = pBVar21[1];
    *pBVar21 = BVar16;
    pBVar21[1].x = 0;
    pBVar21[1].y = 0;
    *(undefined1 *)&pBVar21[2].x = 0;
    std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
    if (local_128._0_8_ != (long)local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_260 != (BRDPoint)&local_250) {
      operator_delete((void *)local_260,(long)local_250 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,(long)local_230 + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,(long)local_170 + 1);
    }
    SDL_LogError(1,"%s",local_158->name);
  }
  local_148.probe = 0;
  local_148.pos.x = 0;
  lVar23 = strtol((char *)local_160,(char **)&local_160,10);
  local_148.probe = (int)lVar23;
  lVar23 = strtol((char *)local_160,(char **)&local_160,10);
  local_148.pos.x = (int)lVar23;
  if ((int)local_c8 < (int)local_148.probe) {
    local_180 = &local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
               ,"");
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
    pBVar21 = (BRDPoint *)(plVar19 + 2);
    if ((BRDPoint *)*plVar19 == pBVar21) {
      local_230 = *pBVar21;
      lStack_228 = plVar19[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *pBVar21;
      local_240 = (BRDPoint *)*plVar19;
    }
    local_238 = plVar19[1];
    *plVar19 = (long)pBVar21;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_260 = (BRDPoint)&local_250;
    std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
    *(undefined2 *)local_260 = 0x3338;
    BVar53.x = 0xf;
    BVar53.y = 0;
    if (local_240 != &local_230) {
      BVar53 = local_230;
    }
    if ((ulong)BVar53 < (ulong)((long)local_258 + local_238)) {
      BVar54.x = 0xf;
      BVar54.y = 0;
      if (local_260 != (BRDPoint)&local_250) {
        BVar54 = local_250;
      }
      if ((ulong)BVar54 < (ulong)((long)local_258 + local_238)) goto LAB_00131984;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
    }
    else {
LAB_00131984:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
    }
    plVar19 = puVar20 + 2;
    if ((long *)*puVar20 == plVar19) {
      local_210 = *plVar19;
      uStack_208 = puVar20[3];
      local_220 = &local_210;
    }
    else {
      local_210 = *plVar19;
      local_220 = (long *)*puVar20;
    }
    local_218 = puVar20[1];
    *puVar20 = plVar19;
    puVar20[1] = 0;
    *(undefined1 *)plVar19 = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_1c0 = &local_1b0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1b0 = *plVar22;
      lStack_1a8 = plVar19[3];
    }
    else {
      local_1b0 = *plVar22;
      local_1c0 = (long *)*plVar19;
    }
    local_1b8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    local_200 = &local_1f0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1f0 = *plVar22;
      lStack_1e8 = plVar19[3];
    }
    else {
      local_1f0 = *plVar22;
      local_200 = (long *)*plVar19;
    }
    local_1f8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_1e0 = &local_1d0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1d0 = *plVar22;
      lStack_1c8 = plVar19[3];
    }
    else {
      local_1d0 = *plVar22;
      local_1e0 = (long *)*plVar19;
    }
    local_1d8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    local_1a0 = &local_190;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_190 = *plVar22;
      lStack_188 = plVar19[3];
    }
    else {
      local_190 = *plVar22;
      local_1a0 = (long *)*plVar19;
    }
    local_198 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
    BVar16 = (BRDPoint)(pBVar21 + 2);
    if (*pBVar21 == BVar16) {
      local_128._16_8_ = *(undefined8 *)BVar16;
      aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
      local_128._0_8_ = (long)local_128 + 0x10;
    }
    else {
      local_128._16_8_ = *(undefined8 *)BVar16;
      local_128._0_8_ = *pBVar21;
    }
    local_128._8_8_ = pBVar21[1];
    *pBVar21 = BVar16;
    pBVar21[1].x = 0;
    pBVar21[1].y = 0;
    *(undefined1 *)&pBVar21[2].x = 0;
    std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
    if (local_128._0_8_ != (long)local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_260 != (BRDPoint)&local_250) {
      operator_delete((void *)local_260,(long)local_250 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,(long)local_230 + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,(long)local_170 + 1);
    }
    SDL_LogError(1,"%s",local_158->name);
  }
  if (local_d8.x < local_148.pos.x) {
    local_180 = &local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
               ,"");
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
    pBVar21 = (BRDPoint *)(plVar19 + 2);
    if ((BRDPoint *)*plVar19 == pBVar21) {
      local_230 = *pBVar21;
      lStack_228 = plVar19[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *pBVar21;
      local_240 = (BRDPoint *)*plVar19;
    }
    local_238 = plVar19[1];
    *plVar19 = (long)pBVar21;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_260 = (BRDPoint)&local_250;
    std::__cxx11::string::_M_construct((ulong)&local_260,'\x02');
    *(undefined2 *)local_260 = 0x3438;
    BVar57.x = 0xf;
    BVar57.y = 0;
    if (local_240 != &local_230) {
      BVar57 = local_230;
    }
    if ((ulong)BVar57 < (ulong)((long)local_258 + local_238)) {
      BVar58.x = 0xf;
      BVar58.y = 0;
      if (local_260 != (BRDPoint)&local_250) {
        BVar58 = local_250;
      }
      if ((ulong)BVar58 < (ulong)((long)local_258 + local_238)) goto LAB_00132326;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
    }
    else {
LAB_00132326:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
    }
    plVar19 = puVar20 + 2;
    if ((long *)*puVar20 == plVar19) {
      local_210 = *plVar19;
      uStack_208 = puVar20[3];
      local_220 = &local_210;
    }
    else {
      local_210 = *plVar19;
      local_220 = (long *)*puVar20;
    }
    local_218 = puVar20[1];
    *puVar20 = plVar19;
    puVar20[1] = 0;
    *(undefined1 *)plVar19 = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_1c0 = &local_1b0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1b0 = *plVar22;
      lStack_1a8 = plVar19[3];
    }
    else {
      local_1b0 = *plVar22;
      local_1c0 = (long *)*plVar19;
    }
    local_1b8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    local_200 = &local_1f0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1f0 = *plVar22;
      lStack_1e8 = plVar19[3];
    }
    else {
      local_1f0 = *plVar22;
      local_200 = (long *)*plVar19;
    }
    local_1f8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_1e0 = &local_1d0;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_1d0 = *plVar22;
      lStack_1c8 = plVar19[3];
    }
    else {
      local_1d0 = *plVar22;
      local_1e0 = (long *)*plVar19;
    }
    local_1d8 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    local_1a0 = &local_190;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_190 = *plVar22;
      lStack_188 = plVar19[3];
    }
    else {
      local_190 = *plVar22;
      local_1a0 = (long *)*plVar19;
    }
    local_198 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1a0);
    BVar16 = (BRDPoint)(pBVar21 + 2);
    if (*pBVar21 == BVar16) {
      local_128._16_8_ = *(undefined8 *)BVar16;
      aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
      local_128._0_8_ = (long)local_128 + 0x10;
    }
    else {
      local_128._16_8_ = *(undefined8 *)BVar16;
      local_128._0_8_ = *pBVar21;
    }
    local_128._8_8_ = pBVar21[1];
    *pBVar21 = BVar16;
    pBVar21[1].x = 0;
    pBVar21[1].y = 0;
    *(undefined1 *)&pBVar21[2].x = 0;
    std::__cxx11::string::operator=((string *)local_158,(string *)local_128);
    if (local_128._0_8_ != (long)local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_260 != (BRDPoint)&local_250) {
      operator_delete((void *)local_260,(long)local_250 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,(long)local_230 + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,(long)local_170 + 1);
    }
    SDL_LogError(1,"%s",local_158->name);
  }
  __position._M_current =
       (pBVar90->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pBVar90->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<BRDPoint,std::allocator<BRDPoint>>::_M_realloc_insert<BRDPoint_const&>
              (local_88,__position,(BRDPoint *)&local_148);
    BVar16 = extraout_RAX;
  }
  else {
    (__position._M_current)->x = local_148.probe;
    (__position._M_current)->y = local_148.pos.x;
    ppBVar1 = &(pBVar90->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
    BVar16 = (BRDPoint)local_148._0_8_;
  }
  goto switchD_0012e528_default;
}

Assistant:

BRD2File::BRD2File(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	std::unordered_map<int, char *> nets; // Map between net id and net name
	unsigned int num_nets = 0;
	BRDPoint max{0, 0}; // Top-right board boundary

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	int current_block = 0;

	std::vector<char *>  lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (strstr(line, "BRDOUT:") == line) {
			current_block = 1;
			p += 7; // Skip "BRDOUT:"
			num_format = READ_UINT();
			max.x      = READ_INT();
			max.y      = READ_INT();
			continue;
		}
		if (strstr(line, "NETS:") == line) {
			current_block = 2;
			p += 5; // Skip "NETS:"
			num_nets = READ_UINT();
			continue;
		}
		if (strstr(line, "PARTS:") == line) {
			current_block = 3;
			p += 6; // Skip "PARTS:"
			num_parts = READ_UINT();
			continue;
		}
		if (strstr(line, "PINS:") == line) {
			current_block = 4;
			p += 5; // Skip "PINS:"
			num_pins = READ_UINT();
			continue;
		}
		if (strstr(line, "NAILS:") == line) {
			current_block = 5;
			p += 6; // Skip "NAILS:"
			num_nails = READ_UINT();
			continue;
		}

		switch (current_block) {
			case 1: { // Format
				ENSURE(format.size() < num_format, error_msg);
				BRDPoint point;
				point.x = READ_INT();
				point.y = READ_INT();
				ENSURE(point.x <= max.x, error_msg);
				ENSURE(point.y <= max.y, error_msg);
				format.push_back(point);
			} break;

			case 2: { // Nets
				ENSURE(nets.size() < num_nets, error_msg);
				int id   = READ_UINT();
				nets[id] = READ_STR();
			} break;

			case 3: { // PARTS
				ENSURE(parts.size() < num_parts, error_msg);
				BRDPart part;

				part.name        = READ_STR();
				part.p1.x        = READ_INT();
				part.p1.y        = READ_INT();
				part.p2.x        = READ_INT();
				part.p2.y        = READ_INT();
				part.end_of_pins = READ_UINT(); // Warning: not end but beginning in this format
				part.part_type   = BRDPartType::SMD;
				int side         = READ_UINT();
				if (side == 1)
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else if (side == 2)
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				else //0
					part.mounting_side = BRDPartMountingSide::Both;

				parts.push_back(part);
			} break;

			case 4: { // PINS
				ENSURE(pins.size() < num_pins, error_msg);
				BRDPin pin;

				pin.pos.x = READ_INT();
				pin.pos.y = READ_INT();
				int netid = READ_UINT();
				unsigned int side  = READ_UINT();
				if (side == 1)
					pin.side = BRDPinSide::Top;
				else if (side == 2)
					pin.side = BRDPinSide::Bottom;
				else //0
					pin.side = BRDPinSide::Both;

				try {
					pin.net = nets.at(netid);
				} catch (const std::out_of_range &e) {
					pin.net = "";
				}

				pin.probe = 1;
				pin.part  = 0;
				pins.push_back(pin);
			} break;

			case 5: { // NAILS
				ENSURE(nails.size() < num_nails, error_msg);
				BRDNail nail;

				nail.probe = READ_UINT();
				nail.pos.x = READ_INT();
				nail.pos.y = READ_INT();
				int netid  = READ_UINT();

				auto inet = nets.find(netid);
				if (inet != nets.end())
					nail.net = inet->second;
				else {
					nail.net = "UNCONNECTED";
					std::cerr << "Missing net id: " << netid << std::endl;
				}

				bool nail_is_top = READ_UINT() == 1;
				if (nail_is_top) {
					nail.side = BRDPartMountingSide::Top;
				} else {
					nail.side = BRDPartMountingSide::Bottom;
					nail.pos.y = max.y - nail.pos.y;
				}
				nails.push_back(nail);

			} break;
			default: continue;
		}
	}

	ENSURE(num_format == format.size(), error_msg);
	ENSURE(num_nets == nets.size(), error_msg);
	ENSURE(num_parts == parts.size(), error_msg);
	ENSURE(num_pins == pins.size(), error_msg);
	ENSURE(num_nails == nails.size(), error_msg);

	/*
	 * Postprocess the data.  Specifically we need to allocate
	 * pins to parts.  So with this it's easiest to just iterate
	 * through the parts and pick up the pins required
	 */
	{
		int pei;     // pin end index (part[i+1].pin# -1
		int cpi = 0; // current pin index
		for (decltype(parts)::size_type i = 0; i < parts.size(); i++) {
			bool isDIP = true;

			if (parts[i].mounting_side == BRDPartMountingSide::Bottom) { // Part on bottom
				parts[i].p1.y = max.y - parts[i].p1.y;
				parts[i].p2.y = max.y - parts[i].p2.y;
			}

			if (i == parts.size() - 1) {
				pei = pins.size();
			} else {
				pei = parts[i + 1].end_of_pins; // Again, not end of pins but beginning
			}

			while (cpi < pei) {
				pins[cpi].part                           = i + 1;
				if (pins[cpi].side != BRDPinSide::Top) pins[cpi].pos.y = max.y - pins[cpi].pos.y;
				if ((pins[cpi].side == BRDPinSide::Top && parts[i].mounting_side == BRDPartMountingSide::Top) ||
				    (pins[cpi].side == BRDPinSide::Bottom && parts[i].mounting_side == BRDPartMountingSide::Bottom)) {
					// Pins on the same side as the part
					isDIP = false;
				}
				cpi++;
			}

			if (isDIP) {
				// All pins are through hole so part is DIP
				parts[i].part_type     = BRDPartType::ThroughHole;
				parts[i].mounting_side = BRDPartMountingSide::Both;
			} else {
				parts[i].part_type = BRDPartType::SMD;
			}
		}
	}

	for (auto i = 1; i <= 2; i++) { // Add dummy parts for probe points on both sides
		BRDPart part;
		part.name = "...";
		part.mounting_side =
		    (i == 1 ? BRDPartMountingSide::Bottom : BRDPartMountingSide::Top); // First part is bottom, last is top.
		part.end_of_pins = 0;                                                  // Unused
		parts.push_back(part);
	}

	AddNailsAsPins();

	valid = current_block != 0;
}